

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  long lVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  byte bVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar80;
  undefined1 auVar89 [16];
  long lVar73;
  uint uVar74;
  ulong uVar75;
  size_t sVar76;
  byte bVar77;
  ulong uVar78;
  float fVar79;
  float fVar131;
  float fVar133;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar86 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar87 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar88 [16];
  float fVar137;
  float fVar138;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar139;
  undefined4 uVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined8 uVar159;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar162;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar163;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar173;
  float fVar181;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [16];
  size_t local_610;
  undefined1 (*local_608) [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar215 [64];
  
  PVar8 = prim[1];
  uVar78 = (ulong)(byte)PVar8;
  lVar62 = uVar78 * 0x19;
  fVar163 = *(float *)(prim + lVar62 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar164 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar165 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + lVar62 + 6));
  fVar172 = fVar163 * auVar165._0_4_;
  fVar139 = fVar163 * auVar164._0_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar81);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar20);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar94 = vpmovsxbd_avx2(auVar6);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar95 = vpmovsxbd_avx2(auVar89);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar84);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar98 = vcvtdq2ps_avx(auVar100);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar78 + 6);
  auVar97 = vpmovsxbd_avx2(auVar85);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar75 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar105 = vpmovsxbd_avx2(auVar83);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar75 + uVar78 + 6);
  auVar104 = vpmovsxbd_avx2(auVar82);
  auVar104 = vcvtdq2ps_avx(auVar104);
  uVar69 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar92 = vpmovsxbd_avx2(auVar7);
  auVar99 = vcvtdq2ps_avx(auVar92);
  auVar208._4_4_ = fVar139;
  auVar208._0_4_ = fVar139;
  auVar208._8_4_ = fVar139;
  auVar208._12_4_ = fVar139;
  auVar208._16_4_ = fVar139;
  auVar208._20_4_ = fVar139;
  auVar208._24_4_ = fVar139;
  auVar208._28_4_ = fVar139;
  auVar210._8_4_ = 1;
  auVar210._0_8_ = 0x100000001;
  auVar210._12_4_ = 1;
  auVar210._16_4_ = 1;
  auVar210._20_4_ = 1;
  auVar210._24_4_ = 1;
  auVar210._28_4_ = 1;
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = ZEXT1632(CONCAT412(fVar163 * auVar164._12_4_,
                                CONCAT48(fVar163 * auVar164._8_4_,
                                         CONCAT44(fVar163 * auVar164._4_4_,fVar139))));
  auVar101 = vpermps_avx2(auVar210,auVar102);
  auVar91 = vpermps_avx512vl(auVar90,auVar102);
  fVar139 = auVar91._0_4_;
  fVar154 = auVar91._4_4_;
  auVar102._4_4_ = fVar154 * auVar94._4_4_;
  auVar102._0_4_ = fVar139 * auVar94._0_4_;
  fVar155 = auVar91._8_4_;
  auVar102._8_4_ = fVar155 * auVar94._8_4_;
  fVar156 = auVar91._12_4_;
  auVar102._12_4_ = fVar156 * auVar94._12_4_;
  fVar162 = auVar91._16_4_;
  auVar102._16_4_ = fVar162 * auVar94._16_4_;
  fVar157 = auVar91._20_4_;
  auVar102._20_4_ = fVar157 * auVar94._20_4_;
  fVar158 = auVar91._24_4_;
  auVar102._24_4_ = fVar158 * auVar94._24_4_;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar97._4_4_ * fVar154;
  auVar100._0_4_ = auVar97._0_4_ * fVar139;
  auVar100._8_4_ = auVar97._8_4_ * fVar155;
  auVar100._12_4_ = auVar97._12_4_ * fVar156;
  auVar100._16_4_ = auVar97._16_4_ * fVar162;
  auVar100._20_4_ = auVar97._20_4_ * fVar157;
  auVar100._24_4_ = auVar97._24_4_ * fVar158;
  auVar100._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar99._4_4_ * fVar154;
  auVar92._0_4_ = auVar99._0_4_ * fVar139;
  auVar92._8_4_ = auVar99._8_4_ * fVar155;
  auVar92._12_4_ = auVar99._12_4_ * fVar156;
  auVar92._16_4_ = auVar99._16_4_ * fVar162;
  auVar92._20_4_ = auVar99._20_4_ * fVar157;
  auVar92._24_4_ = auVar99._24_4_ * fVar158;
  auVar92._28_4_ = auVar91._28_4_;
  auVar81 = vfmadd231ps_fma(auVar102,auVar101,auVar93);
  auVar20 = vfmadd231ps_fma(auVar100,auVar101,auVar98);
  auVar6 = vfmadd231ps_fma(auVar92,auVar104,auVar101);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar208,auVar96);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar208,auVar95);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar105,auVar208);
  auVar209._4_4_ = fVar172;
  auVar209._0_4_ = fVar172;
  auVar209._8_4_ = fVar172;
  auVar209._12_4_ = fVar172;
  auVar209._16_4_ = fVar172;
  auVar209._20_4_ = fVar172;
  auVar209._24_4_ = fVar172;
  auVar209._28_4_ = fVar172;
  auVar92 = ZEXT1632(CONCAT412(fVar163 * auVar165._12_4_,
                               CONCAT48(fVar163 * auVar165._8_4_,
                                        CONCAT44(fVar163 * auVar165._4_4_,fVar172))));
  auVar100 = vpermps_avx2(auVar210,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  fVar163 = auVar92._0_4_;
  fVar139 = auVar92._4_4_;
  auVar101._4_4_ = fVar139 * auVar94._4_4_;
  auVar101._0_4_ = fVar163 * auVar94._0_4_;
  fVar154 = auVar92._8_4_;
  auVar101._8_4_ = fVar154 * auVar94._8_4_;
  fVar155 = auVar92._12_4_;
  auVar101._12_4_ = fVar155 * auVar94._12_4_;
  fVar156 = auVar92._16_4_;
  auVar101._16_4_ = fVar156 * auVar94._16_4_;
  fVar162 = auVar92._20_4_;
  auVar101._20_4_ = fVar162 * auVar94._20_4_;
  fVar157 = auVar92._24_4_;
  auVar101._24_4_ = fVar157 * auVar94._24_4_;
  auVar101._28_4_ = 1;
  auVar90._4_4_ = auVar97._4_4_ * fVar139;
  auVar90._0_4_ = auVar97._0_4_ * fVar163;
  auVar90._8_4_ = auVar97._8_4_ * fVar154;
  auVar90._12_4_ = auVar97._12_4_ * fVar155;
  auVar90._16_4_ = auVar97._16_4_ * fVar156;
  auVar90._20_4_ = auVar97._20_4_ * fVar162;
  auVar90._24_4_ = auVar97._24_4_ * fVar157;
  auVar90._28_4_ = auVar94._28_4_;
  auVar97._4_4_ = auVar99._4_4_ * fVar139;
  auVar97._0_4_ = auVar99._0_4_ * fVar163;
  auVar97._8_4_ = auVar99._8_4_ * fVar154;
  auVar97._12_4_ = auVar99._12_4_ * fVar155;
  auVar97._16_4_ = auVar99._16_4_ * fVar156;
  auVar97._20_4_ = auVar99._20_4_ * fVar162;
  auVar97._24_4_ = auVar99._24_4_ * fVar157;
  auVar97._28_4_ = auVar92._28_4_;
  auVar89 = vfmadd231ps_fma(auVar101,auVar100,auVar93);
  auVar84 = vfmadd231ps_fma(auVar90,auVar100,auVar98);
  auVar85 = vfmadd231ps_fma(auVar97,auVar100,auVar104);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar209,auVar96);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar209,auVar95);
  auVar199._8_4_ = 0x7fffffff;
  auVar199._0_8_ = 0x7fffffff7fffffff;
  auVar199._12_4_ = 0x7fffffff;
  auVar199._16_4_ = 0x7fffffff;
  auVar199._20_4_ = 0x7fffffff;
  auVar199._24_4_ = 0x7fffffff;
  auVar199._28_4_ = 0x7fffffff;
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar209,auVar105);
  auVar96 = vandps_avx(ZEXT1632(auVar81),auVar199);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar198._16_4_ = 0x219392ef;
  auVar198._20_4_ = 0x219392ef;
  auVar198._24_4_ = 0x219392ef;
  auVar198._28_4_ = 0x219392ef;
  uVar75 = vcmpps_avx512vl(auVar96,auVar198,1);
  bVar13 = (bool)((byte)uVar75 & 1);
  auVar91._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar81._0_4_;
  bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar81._4_4_;
  bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar81._8_4_;
  bVar13 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar81._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar20),auVar199);
  uVar75 = vcmpps_avx512vl(auVar96,auVar198,1);
  bVar13 = (bool)((byte)uVar75 & 1);
  auVar103._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._0_4_;
  bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._4_4_;
  bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._8_4_;
  bVar13 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar20._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar6),auVar199);
  uVar75 = vcmpps_avx512vl(auVar96,auVar198,1);
  bVar13 = (bool)((byte)uVar75 & 1);
  auVar96._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar6._0_4_;
  bVar13 = (bool)((byte)(uVar75 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar6._4_4_;
  bVar13 = (bool)((byte)(uVar75 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar6._8_4_;
  bVar13 = (bool)((byte)(uVar75 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar6._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar75 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar75 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar75 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar75 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar217 = ZEXT3264(auVar94);
  auVar95 = vfnmadd213ps_avx512vl(auVar91,auVar93,auVar94);
  auVar81 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar103);
  auVar95 = vfnmadd213ps_avx512vl(auVar103,auVar93,auVar94);
  auVar20 = vfmadd132ps_fma(auVar95,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar96);
  auVar96 = vfnmadd213ps_avx512vl(auVar96,auVar93,auVar94);
  auVar6 = vfmadd132ps_fma(auVar96,auVar93,auVar93);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar89));
  auVar105._4_4_ = auVar81._4_4_ * auVar96._4_4_;
  auVar105._0_4_ = auVar81._0_4_ * auVar96._0_4_;
  auVar105._8_4_ = auVar81._8_4_ * auVar96._8_4_;
  auVar105._12_4_ = auVar81._12_4_ * auVar96._12_4_;
  auVar105._16_4_ = auVar96._16_4_ * 0.0;
  auVar105._20_4_ = auVar96._20_4_ * 0.0;
  auVar105._24_4_ = auVar96._24_4_ * 0.0;
  auVar105._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar89));
  auVar97 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar170._0_4_ = auVar81._0_4_ * auVar96._0_4_;
  auVar170._4_4_ = auVar81._4_4_ * auVar96._4_4_;
  auVar170._8_4_ = auVar81._8_4_ * auVar96._8_4_;
  auVar170._12_4_ = auVar81._12_4_ * auVar96._12_4_;
  auVar170._16_4_ = auVar96._16_4_ * 0.0;
  auVar170._20_4_ = auVar96._20_4_ * 0.0;
  auVar170._24_4_ = auVar96._24_4_ * 0.0;
  auVar170._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar8 * 0x10 + uVar78 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
  auVar104._4_4_ = auVar20._4_4_ * auVar96._4_4_;
  auVar104._0_4_ = auVar20._0_4_ * auVar96._0_4_;
  auVar104._8_4_ = auVar20._8_4_ * auVar96._8_4_;
  auVar104._12_4_ = auVar20._12_4_ * auVar96._12_4_;
  auVar104._16_4_ = auVar96._16_4_ * 0.0;
  auVar104._20_4_ = auVar96._20_4_ * 0.0;
  auVar104._24_4_ = auVar96._24_4_ * 0.0;
  auVar104._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar93);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
  auVar160._0_4_ = auVar20._0_4_ * auVar96._0_4_;
  auVar160._4_4_ = auVar20._4_4_ * auVar96._4_4_;
  auVar160._8_4_ = auVar20._8_4_ * auVar96._8_4_;
  auVar160._12_4_ = auVar20._12_4_ * auVar96._12_4_;
  auVar160._16_4_ = auVar96._16_4_ * 0.0;
  auVar160._20_4_ = auVar96._20_4_ * 0.0;
  auVar160._24_4_ = auVar96._24_4_ * 0.0;
  auVar160._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 + uVar78 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar99._4_4_ = auVar96._4_4_ * auVar6._4_4_;
  auVar99._0_4_ = auVar96._0_4_ * auVar6._0_4_;
  auVar99._8_4_ = auVar96._8_4_ * auVar6._8_4_;
  auVar99._12_4_ = auVar96._12_4_ * auVar6._12_4_;
  auVar99._16_4_ = auVar96._16_4_ * 0.0;
  auVar99._20_4_ = auVar96._20_4_ * 0.0;
  auVar99._24_4_ = auVar96._24_4_ * 0.0;
  auVar99._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar145._0_4_ = auVar6._0_4_ * auVar96._0_4_;
  auVar145._4_4_ = auVar6._4_4_ * auVar96._4_4_;
  auVar145._8_4_ = auVar6._8_4_ * auVar96._8_4_;
  auVar145._12_4_ = auVar6._12_4_ * auVar96._12_4_;
  auVar145._16_4_ = auVar96._16_4_ * 0.0;
  auVar145._20_4_ = auVar96._20_4_ * 0.0;
  auVar145._24_4_ = auVar96._24_4_ * 0.0;
  auVar145._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar105,auVar170);
  auVar93 = vpminsd_avx2(auVar104,auVar160);
  auVar96 = vmaxps_avx(auVar96,auVar93);
  auVar93 = vpminsd_avx2(auVar99,auVar145);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar94._4_4_ = uVar3;
  auVar94._0_4_ = uVar3;
  auVar94._8_4_ = uVar3;
  auVar94._12_4_ = uVar3;
  auVar94._16_4_ = uVar3;
  auVar94._20_4_ = uVar3;
  auVar94._24_4_ = uVar3;
  auVar94._28_4_ = uVar3;
  auVar93 = vmaxps_avx512vl(auVar93,auVar94);
  auVar96 = vmaxps_avx(auVar96,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_540 = vmulps_avx512vl(auVar96,auVar93);
  auVar218 = ZEXT3264(local_540);
  auVar96 = vpmaxsd_avx2(auVar105,auVar170);
  auVar93 = vpmaxsd_avx2(auVar104,auVar160);
  auVar96 = vminps_avx(auVar96,auVar93);
  auVar93 = vpmaxsd_avx2(auVar99,auVar145);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar95._4_4_ = uVar3;
  auVar95._0_4_ = uVar3;
  auVar95._8_4_ = uVar3;
  auVar95._12_4_ = uVar3;
  auVar95._16_4_ = uVar3;
  auVar95._20_4_ = uVar3;
  auVar95._24_4_ = uVar3;
  auVar95._28_4_ = uVar3;
  auVar93 = vminps_avx512vl(auVar93,auVar95);
  auVar96 = vminps_avx(auVar96,auVar93);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar98);
  uVar21 = vpcmpgtd_avx512vl(auVar97,_DAT_01fe9900);
  uVar159 = vcmpps_avx512vl(local_540,auVar96,2);
  if ((byte)((byte)uVar159 & (byte)uVar21) != 0) {
    uVar75 = (ulong)(byte)((byte)uVar159 & (byte)uVar21);
    local_608 = (undefined1 (*) [32])&local_140;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar219 = ZEXT1664(auVar81);
    sVar76 = k;
    local_610 = k;
    do {
      lVar22 = 0;
      for (uVar69 = uVar75; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar75 = uVar75 - 1 & uVar75;
      uVar3 = *(undefined4 *)(prim + lVar22 * 4 + 6);
      uVar69 = (ulong)(uint)((int)lVar22 << 6);
      uVar74 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar74].ptr;
      auVar81 = *(undefined1 (*) [16])(prim + uVar69 + lVar62 + 0x16);
      if (uVar75 != 0) {
        uVar72 = uVar75 - 1 & uVar75;
        for (uVar78 = uVar75; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        }
        if (uVar72 != 0) {
          for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar20 = *(undefined1 (*) [16])(prim + uVar69 + lVar62 + 0x26);
      auVar6 = *(undefined1 (*) [16])(prim + uVar69 + lVar62 + 0x36);
      auVar89 = *(undefined1 (*) [16])(prim + uVar69 + lVar62 + 0x46);
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar76 * 4)),
                              ZEXT416(*(uint *)(ray + sVar76 * 4 + 0x20)),0x1c);
      auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + sVar76 * 4 + 0x40)),0x28);
      auVar83 = vsubps_avx(auVar81,auVar84);
      uVar140 = auVar83._0_4_;
      auVar164._4_4_ = uVar140;
      auVar164._0_4_ = uVar140;
      auVar164._8_4_ = uVar140;
      auVar164._12_4_ = uVar140;
      auVar85 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar163 = pre->ray_space[k].vz.field_0.m128[0];
      fVar139 = pre->ray_space[k].vz.field_0.m128[1];
      fVar154 = pre->ray_space[k].vz.field_0.m128[2];
      fVar155 = pre->ray_space[k].vz.field_0.m128[3];
      auVar86._0_4_ = fVar163 * auVar83._0_4_;
      auVar86._4_4_ = fVar139 * auVar83._4_4_;
      auVar86._8_4_ = fVar154 * auVar83._8_4_;
      auVar86._12_4_ = fVar155 * auVar83._12_4_;
      auVar85 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar85);
      auVar7 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar164);
      auVar85 = vshufps_avx(auVar81,auVar81,0xff);
      auVar82 = vsubps_avx(auVar20,auVar84);
      uVar140 = auVar82._0_4_;
      auVar174._4_4_ = uVar140;
      auVar174._0_4_ = uVar140;
      auVar174._8_4_ = uVar140;
      auVar174._12_4_ = uVar140;
      auVar83 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      auVar202._0_4_ = fVar163 * auVar82._0_4_;
      auVar202._4_4_ = fVar139 * auVar82._4_4_;
      auVar202._8_4_ = fVar154 * auVar82._8_4_;
      auVar202._12_4_ = fVar155 * auVar82._12_4_;
      auVar83 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar83);
      auVar164 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar174);
      auVar82 = vsubps_avx512vl(auVar6,auVar84);
      uVar140 = auVar82._0_4_;
      auVar175._4_4_ = uVar140;
      auVar175._0_4_ = uVar140;
      auVar175._8_4_ = uVar140;
      auVar175._12_4_ = uVar140;
      auVar83 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      auVar87._0_4_ = fVar163 * auVar82._0_4_;
      auVar87._4_4_ = fVar139 * auVar82._4_4_;
      auVar87._8_4_ = fVar154 * auVar82._8_4_;
      auVar87._12_4_ = fVar155 * auVar82._12_4_;
      auVar83 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar83);
      auVar82 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar175);
      auVar83 = vsubps_avx512vl(auVar89,auVar84);
      uVar140 = auVar83._0_4_;
      auVar165._4_4_ = uVar140;
      auVar165._0_4_ = uVar140;
      auVar165._8_4_ = uVar140;
      auVar165._12_4_ = uVar140;
      auVar84 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar88._0_4_ = fVar163 * auVar83._0_4_;
      auVar88._4_4_ = fVar139 * auVar83._4_4_;
      auVar88._8_4_ = fVar154 * auVar83._8_4_;
      auVar88._12_4_ = fVar155 * auVar83._12_4_;
      auVar84 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar84);
      auVar83 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar165);
      lVar22 = (long)iVar9 * 0x44;
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      uVar140 = auVar7._0_4_;
      local_400._4_4_ = uVar140;
      local_400._0_4_ = uVar140;
      local_400._8_4_ = uVar140;
      local_400._12_4_ = uVar140;
      local_400._16_4_ = uVar140;
      local_400._20_4_ = uVar140;
      local_400._24_4_ = uVar140;
      local_400._28_4_ = uVar140;
      auVar146._8_4_ = 1;
      auVar146._0_8_ = 0x100000001;
      auVar146._12_4_ = 1;
      auVar146._16_4_ = 1;
      auVar146._20_4_ = 1;
      auVar146._24_4_ = 1;
      auVar146._28_4_ = 1;
      local_420 = vpermps_avx2(auVar146,ZEXT1632(auVar7));
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      local_440 = vbroadcastss_avx512vl(auVar164);
      local_460 = vpermps_avx512vl(auVar146,ZEXT1632(auVar164));
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      local_480 = vbroadcastss_avx512vl(auVar82);
      local_4a0 = vpermps_avx512vl(auVar146,ZEXT1632(auVar82));
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0xd8c);
      fVar162 = auVar83._0_4_;
      local_4c0._4_4_ = fVar162;
      local_4c0._0_4_ = fVar162;
      fStack_4b8 = fVar162;
      fStack_4b4 = fVar162;
      fStack_4b0 = fVar162;
      fStack_4ac = fVar162;
      fStack_4a8 = fVar162;
      register0x0000139c = fVar162;
      _local_4e0 = vpermps_avx512vl(auVar146,ZEXT1632(auVar83));
      auVar98 = vmulps_avx512vl(_local_4c0,auVar95);
      auVar97 = vmulps_avx512vl(_local_4e0,auVar95);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_480);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_4a0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_440);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_460);
      auVar99 = vfmadd231ps_avx512vl(auVar98,auVar96,local_400);
      auVar197 = ZEXT3264(auVar99);
      auVar100 = vfmadd231ps_avx512vl(auVar97,auVar96,local_420);
      auVar188 = ZEXT3264(auVar100);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0xd8c);
      auVar92 = vmulps_avx512vl(_local_4c0,auVar104);
      auVar101 = vmulps_avx512vl(_local_4e0,auVar104);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar105,local_480);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_4a0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,local_440);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_460);
      auVar165 = vfmadd231ps_fma(auVar92,auVar98,local_400);
      auVar200 = ZEXT1664(auVar165);
      auVar174 = vfmadd231ps_fma(auVar101,auVar98,local_420);
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar165),auVar99);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar174),auVar100);
      auVar102 = vmulps_avx512vl(auVar100,auVar92);
      auVar90 = vmulps_avx512vl(auVar99,auVar101);
      auVar102 = vsubps_avx512vl(auVar102,auVar90);
      auVar84 = vshufps_avx(auVar20,auVar20,0xff);
      uVar159 = auVar85._0_8_;
      local_80._8_8_ = uVar159;
      local_80._0_8_ = uVar159;
      local_80._16_8_ = uVar159;
      local_80._24_8_ = uVar159;
      local_a0 = vbroadcastsd_avx512vl(auVar84);
      auVar84 = vshufps_avx512vl(auVar6,auVar6,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar84);
      auVar84 = vshufps_avx512vl(auVar89,auVar89,0xff);
      uVar159 = auVar84._0_8_;
      local_e0._8_8_ = uVar159;
      local_e0._0_8_ = uVar159;
      local_e0._16_8_ = uVar159;
      local_e0._24_8_ = uVar159;
      auVar90 = vmulps_avx512vl(local_e0,auVar95);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_c0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,local_a0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_80);
      auVar91 = vmulps_avx512vl(local_e0,auVar104);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar105,local_c0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar97,local_a0);
      auVar175 = vfmadd231ps_fma(auVar91,auVar98,local_80);
      auVar91 = vmulps_avx512vl(auVar101,auVar101);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar92,auVar92);
      auVar103 = vmaxps_avx512vl(auVar90,ZEXT1632(auVar175));
      auVar103 = vmulps_avx512vl(auVar103,auVar103);
      auVar91 = vmulps_avx512vl(auVar103,auVar91);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      uVar159 = vcmpps_avx512vl(auVar102,auVar91,2);
      auVar84 = vblendps_avx(auVar7,auVar81,8);
      auVar202 = auVar219._0_16_;
      auVar85 = vandps_avx512vl(auVar84,auVar202);
      auVar84 = vblendps_avx(auVar164,auVar20,8);
      auVar84 = vandps_avx512vl(auVar84,auVar202);
      auVar85 = vmaxps_avx(auVar85,auVar84);
      auVar84 = vblendps_avx(auVar82,auVar6,8);
      auVar86 = vandps_avx512vl(auVar84,auVar202);
      auVar84 = vblendps_avx(auVar83,auVar89,8);
      auVar84 = vandps_avx512vl(auVar84,auVar202);
      auVar84 = vmaxps_avx(auVar86,auVar84);
      auVar84 = vmaxps_avx(auVar85,auVar84);
      auVar85 = vmovshdup_avx(auVar84);
      auVar85 = vmaxss_avx(auVar85,auVar84);
      auVar84 = vshufpd_avx(auVar84,auVar84,1);
      auVar84 = vmaxss_avx(auVar84,auVar85);
      local_620 = vcvtsi2ss_avx512f(auVar89,iVar9);
      auVar206._0_4_ = local_620._0_4_;
      auVar206._4_4_ = auVar206._0_4_;
      auVar206._8_4_ = auVar206._0_4_;
      auVar206._12_4_ = auVar206._0_4_;
      auVar206._16_4_ = auVar206._0_4_;
      auVar206._20_4_ = auVar206._0_4_;
      auVar206._24_4_ = auVar206._0_4_;
      auVar206._28_4_ = auVar206._0_4_;
      uVar21 = vcmpps_avx512vl(auVar206,_DAT_01faff40,0xe);
      bVar77 = (byte)uVar159 & (byte)uVar21;
      fVar163 = auVar84._0_4_ * 4.7683716e-07;
      auVar207._8_4_ = 2;
      auVar207._0_8_ = 0x200000002;
      auVar207._12_4_ = 2;
      auVar207._16_4_ = 2;
      auVar207._20_4_ = 2;
      auVar207._24_4_ = 2;
      auVar207._28_4_ = 2;
      auVar102 = vpermps_avx512vl(auVar207,ZEXT1632(auVar7));
      auVar216 = ZEXT3264(auVar102);
      local_240 = vpermps_avx2(auVar207,ZEXT1632(auVar164));
      local_260 = vpermps_avx2(auVar207,ZEXT1632(auVar82));
      local_280 = vpermps_avx2(auVar207,ZEXT1632(auVar83));
      uVar70 = *(uint *)(ray + sVar76 * 4 + 0x60);
      local_5a0._0_16_ = ZEXT416(uVar70);
      local_660 = auVar20._0_8_;
      uStack_658 = auVar20._8_8_;
      local_670 = auVar6._0_8_;
      uStack_668 = auVar6._8_8_;
      local_680._0_4_ = auVar89._0_4_;
      fVar139 = (float)local_680;
      local_680._4_4_ = auVar89._4_4_;
      fVar154 = local_680._4_4_;
      uStack_678._0_4_ = auVar89._8_4_;
      fVar155 = (float)uStack_678;
      uStack_678._4_4_ = auVar89._12_4_;
      fVar156 = uStack_678._4_4_;
      local_680 = auVar89._0_8_;
      uStack_678 = auVar89._8_8_;
      if (bVar77 != 0) {
        auVar104 = vmulps_avx512vl(local_280,auVar104);
        auVar105 = vfmadd213ps_avx512vl(auVar105,local_260,auVar104);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_240,auVar105);
        auVar97 = vfmadd213ps_avx512vl(auVar98,auVar102,auVar97);
        auVar95 = vmulps_avx512vl(local_280,auVar95);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_260,auVar95);
        auVar105 = vfmadd213ps_avx512vl(auVar93,local_240,auVar94);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar96,auVar102,auVar105);
        auVar203._0_4_ = fVar162 * auVar98._0_4_;
        auVar203._4_4_ = fVar162 * auVar98._4_4_;
        auVar203._8_4_ = fVar162 * auVar98._8_4_;
        auVar203._12_4_ = fVar162 * auVar98._12_4_;
        auVar203._16_4_ = fVar162 * auVar98._16_4_;
        auVar203._20_4_ = fVar162 * auVar98._20_4_;
        auVar203._24_4_ = fVar162 * auVar98._24_4_;
        auVar203._28_4_ = 0;
        auVar96 = vmulps_avx512vl(_local_4e0,auVar98);
        auVar98 = vmulps_avx512vl(local_280,auVar98);
        auVar104 = vfmadd231ps_avx512vl(auVar203,auVar95,local_480);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,local_4a0);
        auVar95 = vfmadd231ps_avx512vl(auVar98,local_260,auVar95);
        auVar98 = vfmadd231ps_avx512vl(auVar104,auVar94,local_440);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,local_460);
        auVar104 = vfmadd231ps_avx512vl(auVar95,local_240,auVar94);
        auVar89 = vfmadd231ps_fma(auVar98,auVar93,local_400);
        auVar98 = vfmadd231ps_avx512vl(auVar96,auVar93,local_420);
        auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1f9c);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar93);
        auVar28._4_4_ = fVar162 * auVar95._4_4_;
        auVar28._0_4_ = fVar162 * auVar95._0_4_;
        auVar28._8_4_ = fVar162 * auVar95._8_4_;
        auVar28._12_4_ = fVar162 * auVar95._12_4_;
        auVar28._16_4_ = fVar162 * auVar95._16_4_;
        auVar28._20_4_ = fVar162 * auVar95._20_4_;
        auVar28._24_4_ = fVar162 * auVar95._24_4_;
        auVar28._28_4_ = auVar93._28_4_;
        auVar93 = vmulps_avx512vl(_local_4e0,auVar95);
        auVar95 = vmulps_avx512vl(local_280,auVar95);
        auVar219 = ZEXT1664(auVar202);
        auVar91 = vfmadd231ps_avx512vl(auVar28,auVar94,local_480);
        auVar103 = vfmadd231ps_avx512vl(auVar93,auVar94,local_4a0);
        auVar94 = vfmadd231ps_avx512vl(auVar95,local_260,auVar94);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar95 = vfmadd231ps_avx512vl(auVar91,auVar93,local_440);
        auVar91 = vfmadd231ps_avx512vl(auVar103,auVar93,local_460);
        auVar93 = vfmadd231ps_avx512vl(auVar94,local_240,auVar93);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar217 = ZEXT3264(auVar103);
        auVar84 = vfmadd231ps_fma(auVar95,auVar96,local_400);
        auVar94 = vfmadd231ps_avx512vl(auVar91,auVar96,local_420);
        auVar95 = vfmadd231ps_avx512vl(auVar93,auVar102,auVar96);
        auVar211._8_4_ = 0x7fffffff;
        auVar211._0_8_ = 0x7fffffff7fffffff;
        auVar211._12_4_ = 0x7fffffff;
        auVar211._16_4_ = 0x7fffffff;
        auVar211._20_4_ = 0x7fffffff;
        auVar211._24_4_ = 0x7fffffff;
        auVar211._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(ZEXT1632(auVar89),auVar211);
        auVar93 = vandps_avx(auVar98,auVar211);
        auVar93 = vmaxps_avx(auVar96,auVar93);
        auVar96 = vandps_avx(auVar104,auVar211);
        auVar96 = vmaxps_avx(auVar93,auVar96);
        auVar205._4_4_ = fVar163;
        auVar205._0_4_ = fVar163;
        auVar205._8_4_ = fVar163;
        auVar205._12_4_ = fVar163;
        auVar205._16_4_ = fVar163;
        auVar205._20_4_ = fVar163;
        auVar205._24_4_ = fVar163;
        auVar205._28_4_ = fVar163;
        uVar69 = vcmpps_avx512vl(auVar96,auVar205,1);
        bVar13 = (bool)((byte)uVar69 & 1);
        auVar106._0_4_ = (float)((uint)bVar13 * auVar92._0_4_ | (uint)!bVar13 * auVar89._0_4_);
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar89._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar89._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar89._12_4_);
        fVar157 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_);
        auVar106._16_4_ = fVar157;
        fVar162 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_);
        auVar106._20_4_ = fVar162;
        fVar158 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_);
        auVar106._24_4_ = fVar158;
        uVar71 = (uint)(byte)(uVar69 >> 7) * auVar92._28_4_;
        auVar106._28_4_ = uVar71;
        bVar13 = (bool)((byte)uVar69 & 1);
        auVar107._0_4_ = (float)((uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar98._0_4_);
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar98._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar98._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar98._12_4_);
        bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar98._16_4_);
        bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar98._20_4_);
        bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar98._24_4_);
        bVar13 = SUB81(uVar69 >> 7,0);
        auVar107._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar98._28_4_;
        auVar96 = vandps_avx(auVar211,ZEXT1632(auVar84));
        auVar93 = vandps_avx(auVar94,auVar211);
        auVar93 = vmaxps_avx(auVar96,auVar93);
        auVar96 = vandps_avx(auVar95,auVar211);
        auVar96 = vmaxps_avx(auVar93,auVar96);
        uVar69 = vcmpps_avx512vl(auVar96,auVar205,1);
        bVar13 = (bool)((byte)uVar69 & 1);
        auVar108._0_4_ = (float)((uint)bVar13 * auVar92._0_4_ | (uint)!bVar13 * auVar84._0_4_);
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar84._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar84._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar84._12_4_);
        fVar172 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_);
        auVar108._16_4_ = fVar172;
        fVar173 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_);
        auVar108._20_4_ = fVar173;
        fVar181 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_);
        auVar108._24_4_ = fVar181;
        auVar108._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar92._28_4_;
        bVar13 = (bool)((byte)uVar69 & 1);
        auVar109._0_4_ = (float)((uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar94._0_4_);
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar94._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar94._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar94._12_4_);
        bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar94._16_4_);
        bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar94._20_4_);
        bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar94._24_4_);
        bVar13 = SUB81(uVar69 >> 7,0);
        auVar109._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar94._28_4_;
        auVar87 = vxorps_avx512vl(local_440._0_16_,local_440._0_16_);
        auVar96 = vfmadd213ps_avx512vl(auVar106,auVar106,ZEXT1632(auVar87));
        auVar89 = vfmadd231ps_fma(auVar96,auVar107,auVar107);
        auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
        fVar79 = auVar96._0_4_;
        fVar80 = auVar96._4_4_;
        fVar131 = auVar96._8_4_;
        fVar132 = auVar96._12_4_;
        fVar133 = auVar96._16_4_;
        fVar134 = auVar96._20_4_;
        fVar135 = auVar96._24_4_;
        auVar29._4_4_ = fVar80 * fVar80 * fVar80 * auVar89._4_4_ * -0.5;
        auVar29._0_4_ = fVar79 * fVar79 * fVar79 * auVar89._0_4_ * -0.5;
        auVar29._8_4_ = fVar131 * fVar131 * fVar131 * auVar89._8_4_ * -0.5;
        auVar29._12_4_ = fVar132 * fVar132 * fVar132 * auVar89._12_4_ * -0.5;
        auVar29._16_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar29._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
        auVar29._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
        auVar29._28_4_ = 0;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar94 = vfmadd231ps_avx512vl(auVar29,auVar93,auVar96);
        auVar30._4_4_ = auVar107._4_4_ * auVar94._4_4_;
        auVar30._0_4_ = auVar107._0_4_ * auVar94._0_4_;
        auVar30._8_4_ = auVar107._8_4_ * auVar94._8_4_;
        auVar30._12_4_ = auVar107._12_4_ * auVar94._12_4_;
        auVar30._16_4_ = auVar107._16_4_ * auVar94._16_4_;
        auVar30._20_4_ = auVar107._20_4_ * auVar94._20_4_;
        auVar30._24_4_ = auVar107._24_4_ * auVar94._24_4_;
        auVar30._28_4_ = auVar96._28_4_;
        auVar31._4_4_ = auVar94._4_4_ * -auVar106._4_4_;
        auVar31._0_4_ = auVar94._0_4_ * -auVar106._0_4_;
        auVar31._8_4_ = auVar94._8_4_ * -auVar106._8_4_;
        auVar31._12_4_ = auVar94._12_4_ * -auVar106._12_4_;
        auVar31._16_4_ = auVar94._16_4_ * -fVar157;
        auVar31._20_4_ = auVar94._20_4_ * -fVar162;
        auVar31._24_4_ = auVar94._24_4_ * -fVar158;
        auVar31._28_4_ = uVar71 ^ 0x80000000;
        auVar96 = vmulps_avx512vl(auVar94,ZEXT1632(auVar87));
        auVar92 = ZEXT1632(auVar87);
        auVar95 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar92);
        auVar89 = vfmadd231ps_fma(auVar95,auVar109,auVar109);
        auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar89));
        fVar162 = auVar95._0_4_;
        fVar157 = auVar95._4_4_;
        fVar158 = auVar95._8_4_;
        fVar79 = auVar95._12_4_;
        fVar80 = auVar95._16_4_;
        fVar131 = auVar95._20_4_;
        fVar132 = auVar95._24_4_;
        auVar32._4_4_ = fVar157 * fVar157 * fVar157 * auVar89._4_4_ * -0.5;
        auVar32._0_4_ = fVar162 * fVar162 * fVar162 * auVar89._0_4_ * -0.5;
        auVar32._8_4_ = fVar158 * fVar158 * fVar158 * auVar89._8_4_ * -0.5;
        auVar32._12_4_ = fVar79 * fVar79 * fVar79 * auVar89._12_4_ * -0.5;
        auVar32._16_4_ = fVar80 * fVar80 * fVar80 * -0.0;
        auVar32._20_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar32._24_4_ = fVar132 * fVar132 * fVar132 * -0.0;
        auVar32._28_4_ = 0;
        auVar93 = vfmadd231ps_avx512vl(auVar32,auVar93,auVar95);
        auVar33._4_4_ = auVar109._4_4_ * auVar93._4_4_;
        auVar33._0_4_ = auVar109._0_4_ * auVar93._0_4_;
        auVar33._8_4_ = auVar109._8_4_ * auVar93._8_4_;
        auVar33._12_4_ = auVar109._12_4_ * auVar93._12_4_;
        auVar33._16_4_ = auVar109._16_4_ * auVar93._16_4_;
        auVar33._20_4_ = auVar109._20_4_ * auVar93._20_4_;
        auVar33._24_4_ = auVar109._24_4_ * auVar93._24_4_;
        auVar33._28_4_ = auVar95._28_4_;
        auVar34._4_4_ = -auVar108._4_4_ * auVar93._4_4_;
        auVar34._0_4_ = -auVar108._0_4_ * auVar93._0_4_;
        auVar34._8_4_ = -auVar108._8_4_ * auVar93._8_4_;
        auVar34._12_4_ = -auVar108._12_4_ * auVar93._12_4_;
        auVar34._16_4_ = -fVar172 * auVar93._16_4_;
        auVar34._20_4_ = -fVar173 * auVar93._20_4_;
        auVar34._24_4_ = -fVar181 * auVar93._24_4_;
        auVar34._28_4_ = auVar94._28_4_;
        auVar93 = vmulps_avx512vl(auVar93,auVar92);
        auVar89 = vfmadd213ps_fma(auVar30,auVar90,auVar99);
        auVar84 = vfmadd213ps_fma(auVar31,auVar90,auVar100);
        auVar94 = vfmadd213ps_avx512vl(auVar96,auVar90,auVar105);
        auVar95 = vfmadd213ps_avx512vl(auVar33,ZEXT1632(auVar175),ZEXT1632(auVar165));
        auVar164 = vfnmadd213ps_fma(auVar30,auVar90,auVar99);
        auVar104 = ZEXT1632(auVar175);
        auVar85 = vfmadd213ps_fma(auVar34,auVar104,ZEXT1632(auVar174));
        auVar86 = vfnmadd213ps_fma(auVar31,auVar90,auVar100);
        auVar83 = vfmadd213ps_fma(auVar93,auVar104,auVar97);
        auVar98 = vfnmadd231ps_avx512vl(auVar105,auVar90,auVar96);
        auVar165 = vfnmadd213ps_fma(auVar33,auVar104,ZEXT1632(auVar165));
        auVar174 = vfnmadd213ps_fma(auVar34,auVar104,ZEXT1632(auVar174));
        auVar202 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar175),auVar93);
        auVar93 = vsubps_avx512vl(auVar95,ZEXT1632(auVar164));
        auVar96 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar86));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar83),auVar98);
        auVar105 = vmulps_avx512vl(auVar96,auVar98);
        auVar82 = vfmsub231ps_fma(auVar105,ZEXT1632(auVar86),auVar97);
        auVar35._4_4_ = auVar164._4_4_ * auVar97._4_4_;
        auVar35._0_4_ = auVar164._0_4_ * auVar97._0_4_;
        auVar35._8_4_ = auVar164._8_4_ * auVar97._8_4_;
        auVar35._12_4_ = auVar164._12_4_ * auVar97._12_4_;
        auVar35._16_4_ = auVar97._16_4_ * 0.0;
        auVar35._20_4_ = auVar97._20_4_ * 0.0;
        auVar35._24_4_ = auVar97._24_4_ * 0.0;
        auVar35._28_4_ = auVar97._28_4_;
        auVar97 = vfmsub231ps_avx512vl(auVar35,auVar98,auVar93);
        auVar36._4_4_ = auVar86._4_4_ * auVar93._4_4_;
        auVar36._0_4_ = auVar86._0_4_ * auVar93._0_4_;
        auVar36._8_4_ = auVar86._8_4_ * auVar93._8_4_;
        auVar36._12_4_ = auVar86._12_4_ * auVar93._12_4_;
        auVar36._16_4_ = auVar93._16_4_ * 0.0;
        auVar36._20_4_ = auVar93._20_4_ * 0.0;
        auVar36._24_4_ = auVar93._24_4_ * 0.0;
        auVar36._28_4_ = auVar93._28_4_;
        auVar7 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar164),auVar96);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar92,auVar97);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,ZEXT1632(auVar82));
        auVar101 = ZEXT1632(auVar87);
        uVar69 = vcmpps_avx512vl(auVar96,auVar101,2);
        bVar68 = (byte)uVar69;
        fVar79 = (float)((uint)(bVar68 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar165._0_4_);
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar131 = (float)((uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar165._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar133 = (float)((uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar165._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar135 = (float)((uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar165._12_4_);
        auVar105 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar79))));
        fVar80 = (float)((uint)(bVar68 & 1) * auVar84._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar174._0_4_);
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar132 = (float)((uint)bVar13 * auVar84._4_4_ | (uint)!bVar13 * auVar174._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar134 = (float)((uint)bVar13 * auVar84._8_4_ | (uint)!bVar13 * auVar174._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar136 = (float)((uint)bVar13 * auVar84._12_4_ | (uint)!bVar13 * auVar174._12_4_);
        auVar104 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar80))));
        auVar110._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar202._0_4_
                    );
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar202._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar202._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar202._12_4_);
        fVar162 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_);
        auVar110._16_4_ = fVar162;
        fVar157 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_);
        auVar110._20_4_ = fVar157;
        fVar158 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_);
        auVar110._24_4_ = fVar158;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
        auVar110._28_4_ = iVar1;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar164),auVar95);
        auVar111._0_4_ =
             (uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar82._0_4_;
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar82._4_4_;
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar82._8_4_;
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar82._12_4_;
        auVar111._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_;
        auVar111._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_;
        auVar111._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_;
        auVar111._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar85));
        auVar112._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar84._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar84._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar84._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar84._12_4_);
        fVar181 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_);
        auVar112._16_4_ = fVar181;
        fVar172 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_);
        auVar112._20_4_ = fVar172;
        fVar173 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_);
        auVar112._24_4_ = fVar173;
        auVar112._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar83));
        auVar113._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar94._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar94._4_4_);
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar94._8_4_);
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar94._12_4_);
        bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar13 * auVar93._16_4_ | (uint)!bVar13 * auVar94._16_4_);
        bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar13 * auVar93._20_4_ | (uint)!bVar13 * auVar94._20_4_);
        bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar13 * auVar93._24_4_ | (uint)!bVar13 * auVar94._24_4_);
        bVar13 = SUB81(uVar69 >> 7,0);
        auVar113._28_4_ = (uint)bVar13 * auVar93._28_4_ | (uint)!bVar13 * auVar94._28_4_;
        auVar114._0_4_ =
             (uint)(bVar68 & 1) * (int)auVar164._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar95._0_4_;
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar13 * (int)auVar164._4_4_ | (uint)!bVar13 * auVar95._4_4_;
        bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar13 * (int)auVar164._8_4_ | (uint)!bVar13 * auVar95._8_4_;
        bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar13 * (int)auVar164._12_4_ | (uint)!bVar13 * auVar95._12_4_;
        auVar114._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar95._16_4_;
        auVar114._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar95._20_4_;
        auVar114._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar95._24_4_;
        auVar114._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar95._28_4_;
        bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._0_4_ =
             (uint)(bVar68 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar83._0_4_;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar83._4_4_;
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar83._8_4_;
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar83._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar98._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar98._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar98._24_4_;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar98._28_4_;
        auVar115._28_4_ = iVar2;
        auVar99 = vsubps_avx512vl(auVar114,auVar105);
        auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar86._12_4_ |
                                                (uint)!bVar16 * auVar85._12_4_,
                                                CONCAT48((uint)bVar15 * (int)auVar86._8_4_ |
                                                         (uint)!bVar15 * auVar85._8_4_,
                                                         CONCAT44((uint)bVar13 * (int)auVar86._4_4_
                                                                  | (uint)!bVar13 * auVar85._4_4_,
                                                                  (uint)(bVar68 & 1) *
                                                                  (int)auVar86._0_4_ |
                                                                  (uint)!(bool)(bVar68 & 1) *
                                                                  auVar85._0_4_)))),auVar104);
        auVar197 = ZEXT3264(auVar93);
        auVar94 = vsubps_avx(auVar115,auVar110);
        auVar95 = vsubps_avx(auVar105,auVar111);
        auVar200 = ZEXT3264(auVar95);
        auVar98 = vsubps_avx(auVar104,auVar112);
        auVar97 = vsubps_avx(auVar110,auVar113);
        auVar37._4_4_ = auVar94._4_4_ * fVar131;
        auVar37._0_4_ = auVar94._0_4_ * fVar79;
        auVar37._8_4_ = auVar94._8_4_ * fVar133;
        auVar37._12_4_ = auVar94._12_4_ * fVar135;
        auVar37._16_4_ = auVar94._16_4_ * 0.0;
        auVar37._20_4_ = auVar94._20_4_ * 0.0;
        auVar37._24_4_ = auVar94._24_4_ * 0.0;
        auVar37._28_4_ = iVar2;
        auVar89 = vfmsub231ps_fma(auVar37,auVar110,auVar99);
        auVar38._4_4_ = fVar132 * auVar99._4_4_;
        auVar38._0_4_ = fVar80 * auVar99._0_4_;
        auVar38._8_4_ = fVar134 * auVar99._8_4_;
        auVar38._12_4_ = fVar136 * auVar99._12_4_;
        auVar38._16_4_ = auVar99._16_4_ * 0.0;
        auVar38._20_4_ = auVar99._20_4_ * 0.0;
        auVar38._24_4_ = auVar99._24_4_ * 0.0;
        auVar38._28_4_ = auVar96._28_4_;
        auVar84 = vfmsub231ps_fma(auVar38,auVar105,auVar93);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar101,ZEXT1632(auVar89));
        auVar182._0_4_ = auVar93._0_4_ * auVar110._0_4_;
        auVar182._4_4_ = auVar93._4_4_ * auVar110._4_4_;
        auVar182._8_4_ = auVar93._8_4_ * auVar110._8_4_;
        auVar182._12_4_ = auVar93._12_4_ * auVar110._12_4_;
        auVar182._16_4_ = auVar93._16_4_ * fVar162;
        auVar182._20_4_ = auVar93._20_4_ * fVar157;
        auVar182._24_4_ = auVar93._24_4_ * fVar158;
        auVar182._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar182,auVar104,auVar94);
        auVar100 = vfmadd231ps_avx512vl(auVar96,auVar101,ZEXT1632(auVar89));
        auVar96 = vmulps_avx512vl(auVar97,auVar111);
        auVar96 = vfmsub231ps_avx512vl(auVar96,auVar95,auVar113);
        auVar39._4_4_ = auVar98._4_4_ * auVar113._4_4_;
        auVar39._0_4_ = auVar98._0_4_ * auVar113._0_4_;
        auVar39._8_4_ = auVar98._8_4_ * auVar113._8_4_;
        auVar39._12_4_ = auVar98._12_4_ * auVar113._12_4_;
        auVar39._16_4_ = auVar98._16_4_ * auVar113._16_4_;
        auVar39._20_4_ = auVar98._20_4_ * auVar113._20_4_;
        auVar39._24_4_ = auVar98._24_4_ * auVar113._24_4_;
        auVar39._28_4_ = auVar113._28_4_;
        auVar89 = vfmsub231ps_fma(auVar39,auVar112,auVar97);
        auVar183._0_4_ = auVar112._0_4_ * auVar95._0_4_;
        auVar183._4_4_ = auVar112._4_4_ * auVar95._4_4_;
        auVar183._8_4_ = auVar112._8_4_ * auVar95._8_4_;
        auVar183._12_4_ = auVar112._12_4_ * auVar95._12_4_;
        auVar183._16_4_ = fVar181 * auVar95._16_4_;
        auVar183._20_4_ = fVar172 * auVar95._20_4_;
        auVar183._24_4_ = fVar173 * auVar95._24_4_;
        auVar183._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar183,auVar98,auVar111);
        auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar101,auVar96);
        auVar92 = vfmadd231ps_avx512vl(auVar96,auVar101,ZEXT1632(auVar89));
        auVar188 = ZEXT3264(auVar92);
        auVar96 = vmaxps_avx(auVar100,auVar92);
        uVar159 = vcmpps_avx512vl(auVar96,auVar101,2);
        bVar77 = bVar77 & (byte)uVar159;
        if (bVar77 != 0) {
          uVar140 = *(undefined4 *)(ray + sVar76 * 4 + 0x100);
          auVar212._4_4_ = uVar140;
          auVar212._0_4_ = uVar140;
          auVar212._8_4_ = uVar140;
          auVar212._12_4_ = uVar140;
          auVar212._16_4_ = uVar140;
          auVar212._20_4_ = uVar140;
          auVar212._24_4_ = uVar140;
          auVar212._28_4_ = uVar140;
          auVar215 = ZEXT3264(auVar212);
          auVar40._4_4_ = auVar97._4_4_ * auVar93._4_4_;
          auVar40._0_4_ = auVar97._0_4_ * auVar93._0_4_;
          auVar40._8_4_ = auVar97._8_4_ * auVar93._8_4_;
          auVar40._12_4_ = auVar97._12_4_ * auVar93._12_4_;
          auVar40._16_4_ = auVar97._16_4_ * auVar93._16_4_;
          auVar40._20_4_ = auVar97._20_4_ * auVar93._20_4_;
          auVar40._24_4_ = auVar97._24_4_ * auVar93._24_4_;
          auVar40._28_4_ = auVar96._28_4_;
          auVar83 = vfmsub231ps_fma(auVar40,auVar98,auVar94);
          auVar41._4_4_ = auVar94._4_4_ * auVar95._4_4_;
          auVar41._0_4_ = auVar94._0_4_ * auVar95._0_4_;
          auVar41._8_4_ = auVar94._8_4_ * auVar95._8_4_;
          auVar41._12_4_ = auVar94._12_4_ * auVar95._12_4_;
          auVar41._16_4_ = auVar94._16_4_ * auVar95._16_4_;
          auVar41._20_4_ = auVar94._20_4_ * auVar95._20_4_;
          auVar41._24_4_ = auVar94._24_4_ * auVar95._24_4_;
          auVar41._28_4_ = auVar94._28_4_;
          auVar85 = vfmsub231ps_fma(auVar41,auVar99,auVar97);
          auVar42._4_4_ = auVar98._4_4_ * auVar99._4_4_;
          auVar42._0_4_ = auVar98._0_4_ * auVar99._0_4_;
          auVar42._8_4_ = auVar98._8_4_ * auVar99._8_4_;
          auVar42._12_4_ = auVar98._12_4_ * auVar99._12_4_;
          auVar42._16_4_ = auVar98._16_4_ * auVar99._16_4_;
          auVar42._20_4_ = auVar98._20_4_ * auVar99._20_4_;
          auVar42._24_4_ = auVar98._24_4_ * auVar99._24_4_;
          auVar42._28_4_ = auVar98._28_4_;
          auVar82 = vfmsub231ps_fma(auVar42,auVar95,auVar93);
          auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar82));
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar83),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar96 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
          auVar200 = ZEXT3264(auVar96);
          auVar93 = vfnmadd213ps_avx512vl(auVar96,ZEXT1632(auVar84),auVar103);
          auVar89 = vfmadd132ps_fma(auVar93,auVar96,auVar96);
          auVar197 = ZEXT1664(auVar89);
          auVar43._4_4_ = auVar82._4_4_ * auVar110._4_4_;
          auVar43._0_4_ = auVar82._0_4_ * auVar110._0_4_;
          auVar43._8_4_ = auVar82._8_4_ * auVar110._8_4_;
          auVar43._12_4_ = auVar82._12_4_ * auVar110._12_4_;
          auVar43._16_4_ = fVar162 * 0.0;
          auVar43._20_4_ = fVar157 * 0.0;
          auVar43._24_4_ = fVar158 * 0.0;
          auVar43._28_4_ = iVar1;
          auVar85 = vfmadd231ps_fma(auVar43,auVar104,ZEXT1632(auVar85));
          auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar105,ZEXT1632(auVar83));
          fVar162 = auVar89._0_4_;
          fVar157 = auVar89._4_4_;
          fVar158 = auVar89._8_4_;
          fVar172 = auVar89._12_4_;
          local_580 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar172,
                                         CONCAT48(auVar85._8_4_ * fVar158,
                                                  CONCAT44(auVar85._4_4_ * fVar157,
                                                           auVar85._0_4_ * fVar162))));
          auVar201 = ZEXT3264(local_580);
          auVar147._4_4_ = uVar70;
          auVar147._0_4_ = uVar70;
          auVar147._8_4_ = uVar70;
          auVar147._12_4_ = uVar70;
          auVar147._16_4_ = uVar70;
          auVar147._20_4_ = uVar70;
          auVar147._24_4_ = uVar70;
          auVar147._28_4_ = uVar70;
          uVar159 = vcmpps_avx512vl(local_580,auVar212,2);
          uVar21 = vcmpps_avx512vl(auVar147,local_580,2);
          bVar77 = (byte)uVar159 & (byte)uVar21 & bVar77;
          if (bVar77 != 0) {
            uVar78 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar78 = bVar77 & uVar78;
            if ((char)uVar78 != '\0') {
              fVar173 = auVar100._0_4_ * fVar162;
              fVar181 = auVar100._4_4_ * fVar157;
              auVar44._4_4_ = fVar181;
              auVar44._0_4_ = fVar173;
              fVar79 = auVar100._8_4_ * fVar158;
              auVar44._8_4_ = fVar79;
              fVar80 = auVar100._12_4_ * fVar172;
              auVar44._12_4_ = fVar80;
              fVar131 = auVar100._16_4_ * 0.0;
              auVar44._16_4_ = fVar131;
              fVar132 = auVar100._20_4_ * 0.0;
              auVar44._20_4_ = fVar132;
              fVar133 = auVar100._24_4_ * 0.0;
              auVar44._24_4_ = fVar133;
              auVar44._28_4_ = auVar100._28_4_;
              auVar96 = vsubps_avx512vl(auVar103,auVar44);
              local_3e0._0_4_ =
                   (float)((uint)(bVar68 & 1) * (int)fVar173 |
                          (uint)!(bool)(bVar68 & 1) * auVar96._0_4_);
              bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
              local_3e0._4_4_ = (float)((uint)bVar13 * (int)fVar181 | (uint)!bVar13 * auVar96._4_4_)
              ;
              bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar13 * (int)fVar79 | (uint)!bVar13 * auVar96._8_4_);
              bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar13 * (int)fVar80 | (uint)!bVar13 * auVar96._12_4_);
              bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar13 * (int)fVar131 | (uint)!bVar13 * auVar96._16_4_);
              bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar13 * (int)fVar132 | (uint)!bVar13 * auVar96._20_4_);
              bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar13 * (int)fVar133 | (uint)!bVar13 * auVar96._24_4_);
              bVar13 = SUB81(uVar69 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar96._28_4_);
              auVar96 = vsubps_avx(ZEXT1632(auVar175),auVar90);
              auVar89 = vfmadd213ps_fma(auVar96,local_3e0,auVar90);
              uVar140 = *(undefined4 *)((long)pre->ray_space + sVar76 * 4 + -0x20);
              auVar23._4_4_ = uVar140;
              auVar23._0_4_ = uVar140;
              auVar23._8_4_ = uVar140;
              auVar23._12_4_ = uVar140;
              auVar23._16_4_ = uVar140;
              auVar23._20_4_ = uVar140;
              auVar23._24_4_ = uVar140;
              auVar23._28_4_ = uVar140;
              auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                           CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                    CONCAT44(auVar89._4_4_ +
                                                                             auVar89._4_4_,
                                                                             auVar89._0_4_ +
                                                                             auVar89._0_4_)))),
                                        auVar23);
              uVar72 = vcmpps_avx512vl(local_580,auVar96,6);
              uVar78 = uVar78 & uVar72;
              bVar77 = (byte)uVar78;
              if (bVar77 != 0) {
                auVar171._0_4_ = auVar92._0_4_ * fVar162;
                auVar171._4_4_ = auVar92._4_4_ * fVar157;
                auVar171._8_4_ = auVar92._8_4_ * fVar158;
                auVar171._12_4_ = auVar92._12_4_ * fVar172;
                auVar171._16_4_ = auVar92._16_4_ * 0.0;
                auVar171._20_4_ = auVar92._20_4_ * 0.0;
                auVar171._24_4_ = auVar92._24_4_ * 0.0;
                auVar171._28_4_ = 0;
                auVar96 = vsubps_avx512vl(auVar103,auVar171);
                auVar116._0_4_ =
                     (uint)(bVar68 & 1) * (int)auVar171._0_4_ |
                     (uint)!(bool)(bVar68 & 1) * auVar96._0_4_;
                bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar116._4_4_ = (uint)bVar13 * (int)auVar171._4_4_ | (uint)!bVar13 * auVar96._4_4_;
                bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar116._8_4_ = (uint)bVar13 * (int)auVar171._8_4_ | (uint)!bVar13 * auVar96._8_4_;
                bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar116._12_4_ =
                     (uint)bVar13 * (int)auVar171._12_4_ | (uint)!bVar13 * auVar96._12_4_;
                bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar116._16_4_ =
                     (uint)bVar13 * (int)auVar171._16_4_ | (uint)!bVar13 * auVar96._16_4_;
                bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar116._20_4_ =
                     (uint)bVar13 * (int)auVar171._20_4_ | (uint)!bVar13 * auVar96._20_4_;
                bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar116._24_4_ =
                     (uint)bVar13 * (int)auVar171._24_4_ | (uint)!bVar13 * auVar96._24_4_;
                auVar116._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar96._28_4_;
                auVar24._8_4_ = 0x40000000;
                auVar24._0_8_ = 0x4000000040000000;
                auVar24._12_4_ = 0x40000000;
                auVar24._16_4_ = 0x40000000;
                auVar24._20_4_ = 0x40000000;
                auVar24._24_4_ = 0x40000000;
                auVar24._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar116,auVar103,auVar24);
                local_380 = 0;
                auVar200 = ZEXT1664(auVar81);
                local_360 = local_660;
                uStack_358 = uStack_658;
                local_350 = local_670;
                uStack_348 = uStack_668;
                local_340 = local_680;
                uStack_338 = uStack_678;
                if ((pGVar11->mask & *(uint *)(ray + sVar76 * 4 + 0x120)) != 0) {
                  local_5c0._0_8_ = pGVar11;
                  fVar162 = 1.0 / auVar206._0_4_;
                  local_320[0] = fVar162 * (local_3e0._0_4_ + 0.0);
                  local_320[1] = fVar162 * (local_3e0._4_4_ + 1.0);
                  local_320[2] = fVar162 * (local_3e0._8_4_ + 2.0);
                  local_320[3] = fVar162 * (local_3e0._12_4_ + 3.0);
                  fStack_310 = fVar162 * (local_3e0._16_4_ + 4.0);
                  fStack_30c = fVar162 * (local_3e0._20_4_ + 5.0);
                  fStack_308 = fVar162 * (local_3e0._24_4_ + 6.0);
                  fStack_304 = local_3e0._28_4_ + 7.0;
                  local_300 = local_3c0;
                  local_2e0 = local_580;
                  auVar148._8_4_ = 0x7f800000;
                  auVar148._0_8_ = 0x7f8000007f800000;
                  auVar148._12_4_ = 0x7f800000;
                  auVar148._16_4_ = 0x7f800000;
                  auVar148._20_4_ = 0x7f800000;
                  auVar148._24_4_ = 0x7f800000;
                  auVar148._28_4_ = 0x7f800000;
                  auVar96 = vblendmps_avx512vl(auVar148,local_580);
                  auVar117._0_4_ =
                       (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                  auVar117._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                  auVar117._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
                  auVar117._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
                  auVar117._16_4_ = (uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                  auVar117._20_4_ = (uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
                  auVar117._24_4_ = (uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = SUB81(uVar78 >> 7,0);
                  auVar117._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar96 = vshufps_avx(auVar117,auVar117,0xb1);
                  auVar96 = vminps_avx(auVar117,auVar96);
                  auVar93 = vshufpd_avx(auVar96,auVar96,5);
                  auVar96 = vminps_avx(auVar96,auVar93);
                  auVar93 = vpermpd_avx2(auVar96,0x4e);
                  auVar96 = vminps_avx(auVar96,auVar93);
                  uVar159 = vcmpps_avx512vl(auVar117,auVar96,0);
                  uVar70 = (uint)uVar78;
                  if (((byte)uVar159 & bVar77) != 0) {
                    uVar70 = (uint)((byte)uVar159 & bVar77);
                  }
                  uVar71 = 0;
                  for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                    uVar71 = uVar71 + 1;
                  }
                  uVar69 = (ulong)uVar71;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_500 = vpbroadcastd_avx512vl();
                    local_520 = vpbroadcastd_avx512vl();
                    local_5e0 = auVar102;
                    local_3a0 = local_580;
                    local_37c = iVar9;
                    local_370 = auVar81;
                    do {
                      local_1c0 = local_320[uVar69];
                      local_1a0 = *(undefined4 *)(local_300 + uVar69 * 4);
                      *(undefined4 *)(ray + sVar76 * 4 + 0x100) =
                           *(undefined4 *)(local_2e0 + uVar69 * 4);
                      local_650.context = context->user;
                      fVar157 = 1.0 - local_1c0;
                      fVar162 = fVar157 * fVar157 * -3.0;
                      auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157)),
                                                ZEXT416((uint)(local_1c0 * fVar157)),
                                                ZEXT416(0xc0000000));
                      auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar157)),
                                                ZEXT416((uint)(local_1c0 * local_1c0)),
                                                ZEXT416(0x40000000));
                      fVar157 = auVar89._0_4_ * 3.0;
                      fVar158 = auVar84._0_4_ * 3.0;
                      fVar172 = local_1c0 * local_1c0 * 3.0;
                      auVar193._0_4_ = fVar172 * fVar139;
                      auVar193._4_4_ = fVar172 * fVar154;
                      auVar193._8_4_ = fVar172 * fVar155;
                      auVar193._12_4_ = fVar172 * fVar156;
                      auVar143._4_4_ = fVar158;
                      auVar143._0_4_ = fVar158;
                      auVar143._8_4_ = fVar158;
                      auVar143._12_4_ = fVar158;
                      auVar89 = vfmadd132ps_fma(auVar143,auVar193,auVar6);
                      auVar179._4_4_ = fVar157;
                      auVar179._0_4_ = fVar157;
                      auVar179._8_4_ = fVar157;
                      auVar179._12_4_ = fVar157;
                      auVar89 = vfmadd132ps_fma(auVar179,auVar89,auVar20);
                      auVar144._4_4_ = fVar162;
                      auVar144._0_4_ = fVar162;
                      auVar144._8_4_ = fVar162;
                      auVar144._12_4_ = fVar162;
                      auVar89 = vfmadd213ps_fma(auVar144,auVar81,auVar89);
                      local_220 = auVar89._0_4_;
                      auVar187._8_4_ = 1;
                      auVar187._0_8_ = 0x100000001;
                      auVar187._12_4_ = 1;
                      auVar187._16_4_ = 1;
                      auVar187._20_4_ = 1;
                      auVar187._24_4_ = 1;
                      auVar187._28_4_ = 1;
                      local_200 = vpermps_avx2(auVar187,ZEXT1632(auVar89));
                      auVar188 = ZEXT3264(local_200);
                      auVar194._8_4_ = 2;
                      auVar194._0_8_ = 0x200000002;
                      auVar194._12_4_ = 2;
                      auVar196._16_4_ = 2;
                      auVar196._0_16_ = auVar194;
                      auVar196._20_4_ = 2;
                      auVar196._24_4_ = 2;
                      auVar196._28_4_ = 2;
                      auVar197 = ZEXT3264(auVar196);
                      local_1e0 = vpermps_avx2(auVar196,ZEXT1632(auVar89));
                      iStack_21c = local_220;
                      iStack_218 = local_220;
                      iStack_214 = local_220;
                      iStack_210 = local_220;
                      iStack_20c = local_220;
                      iStack_208 = local_220;
                      iStack_204 = local_220;
                      fStack_1bc = local_1c0;
                      fStack_1b8 = local_1c0;
                      fStack_1b4 = local_1c0;
                      fStack_1b0 = local_1c0;
                      fStack_1ac = local_1c0;
                      fStack_1a8 = local_1c0;
                      fStack_1a4 = local_1c0;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_520._0_8_;
                      uStack_178 = local_520._8_8_;
                      uStack_170 = local_520._16_8_;
                      uStack_168 = local_520._24_8_;
                      local_160 = local_500;
                      auVar96 = vpcmpeqd_avx2(local_500,local_500);
                      local_608[1] = auVar96;
                      *local_608 = auVar96;
                      local_140 = (local_650.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_650.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_600 = local_2a0;
                      local_650.valid = (int *)local_600;
                      local_650.geometryUserPtr = *(void **)(local_5c0._0_8_ + 0x18);
                      local_650.hit = (RTCHitN *)&local_220;
                      local_650.N = 8;
                      _local_560 = auVar215._0_32_;
                      local_650.ray = (RTCRayN *)ray;
                      if (*(code **)(local_5c0._0_8_ + 0x40) != (code *)0x0) {
                        auVar188 = ZEXT1664(local_200._0_16_);
                        auVar197 = ZEXT1664(auVar194);
                        (**(code **)(local_5c0._0_8_ + 0x40))(&local_650);
                        auVar201 = ZEXT3264(local_580);
                        auVar215 = ZEXT3264(_local_560);
                        auVar216 = ZEXT3264(local_5e0);
                        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar219 = ZEXT1664(auVar89);
                        auVar218 = ZEXT3264(local_540);
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar217 = ZEXT3264(auVar96);
                        sVar76 = local_610;
                      }
                      if (local_600 == (undefined1  [32])0x0) {
LAB_01c8893f:
                        *(int *)(ray + sVar76 * 4 + 0x100) = auVar215._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_5c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar188 = ZEXT1664(auVar188._0_16_);
                          auVar197 = ZEXT1664(auVar197._0_16_);
                          (*p_Var12)(&local_650);
                          auVar201 = ZEXT3264(local_580);
                          auVar215 = ZEXT3264(_local_560);
                          auVar216 = ZEXT3264(local_5e0);
                          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar219 = ZEXT1664(auVar89);
                          auVar218 = ZEXT3264(local_540);
                          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar217 = ZEXT3264(auVar96);
                          sVar76 = local_610;
                        }
                        if (local_600 == (undefined1  [32])0x0) goto LAB_01c8893f;
                        uVar72 = vptestmd_avx512vl(local_600,local_600);
                        iVar1 = *(int *)(local_650.hit + 4);
                        iVar2 = *(int *)(local_650.hit + 8);
                        iVar63 = *(int *)(local_650.hit + 0xc);
                        iVar64 = *(int *)(local_650.hit + 0x10);
                        iVar65 = *(int *)(local_650.hit + 0x14);
                        iVar66 = *(int *)(local_650.hit + 0x18);
                        iVar67 = *(int *)(local_650.hit + 0x1c);
                        bVar77 = (byte)uVar72;
                        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                        bVar19 = SUB81(uVar72 >> 7,0);
                        *(uint *)(local_650.ray + 0x180) =
                             (uint)(bVar77 & 1) * *(int *)local_650.hit |
                             (uint)!(bool)(bVar77 & 1) * *(int *)(local_650.ray + 0x180);
                        *(uint *)(local_650.ray + 0x184) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x184);
                        *(uint *)(local_650.ray + 0x188) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x188);
                        *(uint *)(local_650.ray + 0x18c) =
                             (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_650.ray + 0x18c)
                        ;
                        *(uint *)(local_650.ray + 400) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_650.ray + 400);
                        *(uint *)(local_650.ray + 0x194) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_650.ray + 0x194)
                        ;
                        *(uint *)(local_650.ray + 0x198) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_650.ray + 0x198)
                        ;
                        *(uint *)(local_650.ray + 0x19c) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_650.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x24);
                        iVar2 = *(int *)(local_650.hit + 0x28);
                        iVar63 = *(int *)(local_650.hit + 0x2c);
                        iVar64 = *(int *)(local_650.hit + 0x30);
                        iVar65 = *(int *)(local_650.hit + 0x34);
                        iVar66 = *(int *)(local_650.hit + 0x38);
                        iVar67 = *(int *)(local_650.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                        bVar19 = SUB81(uVar72 >> 7,0);
                        *(uint *)(local_650.ray + 0x1a0) =
                             (uint)(bVar77 & 1) * *(int *)(local_650.hit + 0x20) |
                             (uint)!(bool)(bVar77 & 1) * *(int *)(local_650.ray + 0x1a0);
                        *(uint *)(local_650.ray + 0x1a4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1a4);
                        *(uint *)(local_650.ray + 0x1a8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1a8);
                        *(uint *)(local_650.ray + 0x1ac) =
                             (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1ac)
                        ;
                        *(uint *)(local_650.ray + 0x1b0) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1b0)
                        ;
                        *(uint *)(local_650.ray + 0x1b4) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1b4)
                        ;
                        *(uint *)(local_650.ray + 0x1b8) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1b8)
                        ;
                        *(uint *)(local_650.ray + 0x1bc) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x44);
                        iVar2 = *(int *)(local_650.hit + 0x48);
                        iVar63 = *(int *)(local_650.hit + 0x4c);
                        iVar64 = *(int *)(local_650.hit + 0x50);
                        iVar65 = *(int *)(local_650.hit + 0x54);
                        iVar66 = *(int *)(local_650.hit + 0x58);
                        iVar67 = *(int *)(local_650.hit + 0x5c);
                        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                        bVar19 = SUB81(uVar72 >> 7,0);
                        *(uint *)(local_650.ray + 0x1c0) =
                             (uint)(bVar77 & 1) * *(int *)(local_650.hit + 0x40) |
                             (uint)!(bool)(bVar77 & 1) * *(int *)(local_650.ray + 0x1c0);
                        *(uint *)(local_650.ray + 0x1c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1c4);
                        *(uint *)(local_650.ray + 0x1c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1c8);
                        *(uint *)(local_650.ray + 0x1cc) =
                             (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1cc)
                        ;
                        *(uint *)(local_650.ray + 0x1d0) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1d0)
                        ;
                        *(uint *)(local_650.ray + 0x1d4) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_650.ray + 0x1d4)
                        ;
                        *(uint *)(local_650.ray + 0x1d8) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1d8)
                        ;
                        *(uint *)(local_650.ray + 0x1dc) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 100);
                        iVar2 = *(int *)(local_650.hit + 0x68);
                        iVar63 = *(int *)(local_650.hit + 0x6c);
                        iVar64 = *(int *)(local_650.hit + 0x70);
                        iVar65 = *(int *)(local_650.hit + 0x74);
                        iVar66 = *(int *)(local_650.hit + 0x78);
                        iVar67 = *(int *)(local_650.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                        bVar19 = SUB81(uVar72 >> 7,0);
                        *(uint *)(local_650.ray + 0x1e0) =
                             (uint)(bVar77 & 1) * *(int *)(local_650.hit + 0x60) |
                             (uint)!(bool)(bVar77 & 1) * *(int *)(local_650.ray + 0x1e0);
                        *(uint *)(local_650.ray + 0x1e4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x1e4);
                        *(uint *)(local_650.ray + 0x1e8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x1e8);
                        *(uint *)(local_650.ray + 0x1ec) =
                             (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_650.ray + 0x1ec)
                        ;
                        *(uint *)(local_650.ray + 0x1f0) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_650.ray + 0x1f0)
                        ;
                        *(uint *)(local_650.ray + 500) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_650.ray + 500);
                        *(uint *)(local_650.ray + 0x1f8) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_650.ray + 0x1f8)
                        ;
                        *(uint *)(local_650.ray + 0x1fc) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_650.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_650.hit + 0x84);
                        iVar2 = *(int *)(local_650.hit + 0x88);
                        iVar63 = *(int *)(local_650.hit + 0x8c);
                        iVar64 = *(int *)(local_650.hit + 0x90);
                        iVar65 = *(int *)(local_650.hit + 0x94);
                        iVar66 = *(int *)(local_650.hit + 0x98);
                        iVar67 = *(int *)(local_650.hit + 0x9c);
                        bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar72 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar72 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar72 >> 6) & 1);
                        bVar19 = SUB81(uVar72 >> 7,0);
                        *(uint *)(local_650.ray + 0x200) =
                             (uint)(bVar77 & 1) * *(int *)(local_650.hit + 0x80) |
                             (uint)!(bool)(bVar77 & 1) * *(int *)(local_650.ray + 0x200);
                        *(uint *)(local_650.ray + 0x204) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_650.ray + 0x204);
                        *(uint *)(local_650.ray + 0x208) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_650.ray + 0x208);
                        *(uint *)(local_650.ray + 0x20c) =
                             (uint)bVar15 * iVar63 | (uint)!bVar15 * *(int *)(local_650.ray + 0x20c)
                        ;
                        *(uint *)(local_650.ray + 0x210) =
                             (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_650.ray + 0x210)
                        ;
                        *(uint *)(local_650.ray + 0x214) =
                             (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_650.ray + 0x214)
                        ;
                        *(uint *)(local_650.ray + 0x218) =
                             (uint)bVar18 * iVar66 | (uint)!bVar18 * *(int *)(local_650.ray + 0x218)
                        ;
                        *(uint *)(local_650.ray + 0x21c) =
                             (uint)bVar19 * iVar67 | (uint)!bVar19 * *(int *)(local_650.ray + 0x21c)
                        ;
                        auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0));
                        *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar96;
                        auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0));
                        *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar96;
                        auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0));
                        *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar96;
                        auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0x100));
                        *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar96;
                        auVar215 = ZEXT464(*(uint *)(ray + sVar76 * 4 + 0x100));
                      }
                      auVar102 = auVar216._0_32_;
                      bVar77 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & (byte)uVar78;
                      uVar140 = auVar215._0_4_;
                      auVar152._4_4_ = uVar140;
                      auVar152._0_4_ = uVar140;
                      auVar152._8_4_ = uVar140;
                      auVar152._12_4_ = uVar140;
                      auVar152._16_4_ = uVar140;
                      auVar152._20_4_ = uVar140;
                      auVar152._24_4_ = uVar140;
                      auVar152._28_4_ = uVar140;
                      uVar159 = vcmpps_avx512vl(auVar201._0_32_,auVar152,2);
                      if ((bVar77 & (byte)uVar159) == 0) goto LAB_01c8780e;
                      bVar77 = bVar77 & (byte)uVar159;
                      uVar78 = (ulong)bVar77;
                      auVar153._8_4_ = 0x7f800000;
                      auVar153._0_8_ = 0x7f8000007f800000;
                      auVar153._12_4_ = 0x7f800000;
                      auVar153._16_4_ = 0x7f800000;
                      auVar153._20_4_ = 0x7f800000;
                      auVar153._24_4_ = 0x7f800000;
                      auVar153._28_4_ = 0x7f800000;
                      auVar96 = vblendmps_avx512vl(auVar153,auVar201._0_32_);
                      auVar130._0_4_ =
                           (uint)(bVar77 & 1) * auVar96._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * 0x7f800000;
                      bVar13 = (bool)(bVar77 >> 1 & 1);
                      auVar130._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar77 >> 2 & 1);
                      auVar130._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar77 >> 3 & 1);
                      auVar130._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar77 >> 4 & 1);
                      auVar130._16_4_ = (uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar77 >> 5 & 1);
                      auVar130._20_4_ = (uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * 0x7f800000;
                      bVar13 = (bool)(bVar77 >> 6 & 1);
                      auVar130._24_4_ = (uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * 0x7f800000;
                      auVar130._28_4_ =
                           (uint)(bVar77 >> 7) * auVar96._28_4_ |
                           (uint)!(bool)(bVar77 >> 7) * 0x7f800000;
                      auVar96 = vshufps_avx(auVar130,auVar130,0xb1);
                      auVar96 = vminps_avx(auVar130,auVar96);
                      auVar93 = vshufpd_avx(auVar96,auVar96,5);
                      auVar96 = vminps_avx(auVar96,auVar93);
                      auVar93 = vpermpd_avx2(auVar96,0x4e);
                      auVar96 = vminps_avx(auVar96,auVar93);
                      uVar159 = vcmpps_avx512vl(auVar130,auVar96,0);
                      bVar68 = (byte)uVar159 & bVar77;
                      if (bVar68 != 0) {
                        bVar77 = bVar68;
                      }
                      uVar70 = 0;
                      for (uVar71 = (uint)bVar77; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x80000000) {
                        uVar70 = uVar70 + 1;
                      }
                      uVar69 = (ulong)uVar70;
                    } while( true );
                  }
                  fVar162 = local_320[uVar69];
                  uVar140 = *(undefined4 *)(local_300 + uVar69 * 4);
                  fVar158 = 1.0 - fVar162;
                  fVar157 = fVar158 * fVar158 * -3.0;
                  auVar188 = ZEXT464((uint)fVar157);
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158)),
                                            ZEXT416((uint)(fVar162 * fVar158)),ZEXT416(0xc0000000));
                  auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar162 * fVar158)),
                                            ZEXT416((uint)(fVar162 * fVar162)),ZEXT416(0x40000000));
                  fVar158 = auVar89._0_4_ * 3.0;
                  fVar172 = auVar84._0_4_ * 3.0;
                  fVar173 = fVar162 * fVar162 * 3.0;
                  auVar189._0_4_ = fVar173 * fVar139;
                  auVar189._4_4_ = fVar173 * fVar154;
                  auVar189._8_4_ = fVar173 * fVar155;
                  auVar189._12_4_ = fVar173 * fVar156;
                  auVar197 = ZEXT1664(auVar189);
                  auVar166._4_4_ = fVar172;
                  auVar166._0_4_ = fVar172;
                  auVar166._8_4_ = fVar172;
                  auVar166._12_4_ = fVar172;
                  auVar89 = vfmadd132ps_fma(auVar166,auVar189,auVar6);
                  auVar176._4_4_ = fVar158;
                  auVar176._0_4_ = fVar158;
                  auVar176._8_4_ = fVar158;
                  auVar176._12_4_ = fVar158;
                  auVar89 = vfmadd132ps_fma(auVar176,auVar89,auVar20);
                  auVar167._4_4_ = fVar157;
                  auVar167._0_4_ = fVar157;
                  auVar167._8_4_ = fVar157;
                  auVar167._12_4_ = fVar157;
                  auVar89 = vfmadd213ps_fma(auVar167,auVar81,auVar89);
                  *(undefined4 *)(ray + sVar76 * 4 + 0x100) =
                       *(undefined4 *)(local_2e0 + uVar69 * 4);
                  *(int *)(ray + sVar76 * 4 + 0x180) = auVar89._0_4_;
                  uVar10 = vextractps_avx(auVar89,1);
                  *(undefined4 *)(ray + sVar76 * 4 + 0x1a0) = uVar10;
                  uVar10 = vextractps_avx(auVar89,2);
                  *(undefined4 *)(ray + sVar76 * 4 + 0x1c0) = uVar10;
                  *(float *)(ray + sVar76 * 4 + 0x1e0) = fVar162;
                  *(undefined4 *)(ray + sVar76 * 4 + 0x200) = uVar140;
                  *(undefined4 *)(ray + sVar76 * 4 + 0x220) = uVar3;
                  *(uint *)(ray + sVar76 * 4 + 0x240) = uVar74;
                  *(uint *)(ray + sVar76 * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + sVar76 * 4 + 0x280) = context->user->instPrimID[0];
LAB_01c8780e:
                  auVar200 = ZEXT1664(auVar81);
                }
              }
            }
          }
        }
      }
      if (8 < iVar9) {
        local_5c0 = vpbroadcastd_avx512vl();
        local_560._4_4_ = fVar163;
        local_560._0_4_ = fVar163;
        fStack_558 = fVar163;
        fStack_554 = fVar163;
        fStack_550 = fVar163;
        fStack_54c = fVar163;
        fStack_548 = fVar163;
        fStack_544 = fVar163;
        local_500._4_4_ = local_5a0._0_4_;
        local_500._0_4_ = local_5a0._0_4_;
        local_500._8_4_ = local_5a0._0_4_;
        local_500._12_4_ = local_5a0._0_4_;
        local_500._16_4_ = local_5a0._0_4_;
        local_500._20_4_ = local_5a0._0_4_;
        local_500._24_4_ = local_5a0._0_4_;
        local_500._28_4_ = local_5a0._0_4_;
        local_100 = 1.0 / (float)local_620._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_520 = vpbroadcastd_avx512vl();
        local_580 = vpbroadcastd_avx512vl();
        lVar73 = 8;
        local_5e0 = auVar102;
LAB_01c878cf:
        auVar96 = vpbroadcastd_avx512vl();
        auVar96 = vpor_avx2(auVar96,_DAT_01fe9900);
        uVar21 = vpcmpd_avx512vl(auVar96,local_5c0,1);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 * 4 + lVar22);
        auVar93 = *(undefined1 (*) [32])(lVar22 + 0x21aa768 + lVar73 * 4);
        auVar94 = *(undefined1 (*) [32])(lVar22 + 0x21aabec + lVar73 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar22 + 0x21ab070 + lVar73 * 4);
        auVar216._0_4_ = auVar95._0_4_ * (float)local_4c0._0_4_;
        auVar216._4_4_ = auVar95._4_4_ * (float)local_4c0._4_4_;
        auVar216._8_4_ = auVar95._8_4_ * fStack_4b8;
        auVar216._12_4_ = auVar95._12_4_ * fStack_4b4;
        auVar216._16_4_ = auVar95._16_4_ * fStack_4b0;
        auVar216._20_4_ = auVar95._20_4_ * fStack_4ac;
        auVar216._28_36_ = auVar197._28_36_;
        auVar216._24_4_ = auVar95._24_4_ * fStack_4a8;
        auVar197._0_4_ = auVar95._0_4_ * (float)local_4e0._0_4_;
        auVar197._4_4_ = auVar95._4_4_ * (float)local_4e0._4_4_;
        auVar197._8_4_ = auVar95._8_4_ * fStack_4d8;
        auVar197._12_4_ = auVar95._12_4_ * fStack_4d4;
        auVar197._16_4_ = auVar95._16_4_ * fStack_4d0;
        auVar197._20_4_ = auVar95._20_4_ * fStack_4cc;
        auVar197._28_36_ = auVar188._28_36_;
        auVar197._24_4_ = auVar95._24_4_ * fStack_4c8;
        auVar98 = vmulps_avx512vl(local_e0,auVar95);
        auVar97 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar94,local_480);
        auVar105 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar94,local_4a0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,local_440);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar93,local_460);
        auVar104 = vfmadd231ps_avx512vl(auVar98,auVar93,local_a0);
        auVar89 = vfmadd231ps_fma(auVar97,auVar96,local_400);
        auVar197 = ZEXT1664(auVar89);
        auVar84 = vfmadd231ps_fma(auVar105,auVar96,local_420);
        auVar188 = ZEXT1664(auVar84);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 * 4 + lVar22);
        auVar97 = *(undefined1 (*) [32])(lVar22 + 0x21acb88 + lVar73 * 4);
        auVar92 = vfmadd231ps_avx512vl(auVar104,auVar96,local_80);
        auVar105 = *(undefined1 (*) [32])(lVar22 + 0x21ad00c + lVar73 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar22 + 0x21ad490 + lVar73 * 4);
        auVar201._0_4_ = auVar104._0_4_ * (float)local_4c0._0_4_;
        auVar201._4_4_ = auVar104._4_4_ * (float)local_4c0._4_4_;
        auVar201._8_4_ = auVar104._8_4_ * fStack_4b8;
        auVar201._12_4_ = auVar104._12_4_ * fStack_4b4;
        auVar201._16_4_ = auVar104._16_4_ * fStack_4b0;
        auVar201._20_4_ = auVar104._20_4_ * fStack_4ac;
        auVar201._28_36_ = auVar200._28_36_;
        auVar201._24_4_ = auVar104._24_4_ * fStack_4a8;
        auVar45._4_4_ = auVar104._4_4_ * (float)local_4e0._4_4_;
        auVar45._0_4_ = auVar104._0_4_ * (float)local_4e0._0_4_;
        auVar45._8_4_ = auVar104._8_4_ * fStack_4d8;
        auVar45._12_4_ = auVar104._12_4_ * fStack_4d4;
        auVar45._16_4_ = auVar104._16_4_ * fStack_4d0;
        auVar45._20_4_ = auVar104._20_4_ * fStack_4cc;
        auVar45._24_4_ = auVar104._24_4_ * fStack_4c8;
        auVar45._28_4_ = uStack_4c4;
        auVar99 = vmulps_avx512vl(local_e0,auVar104);
        auVar100 = vfmadd231ps_avx512vl(auVar201._0_32_,auVar105,local_480);
        auVar101 = vfmadd231ps_avx512vl(auVar45,auVar105,local_4a0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_c0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_440);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_460);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_a0);
        auVar85 = vfmadd231ps_fma(auVar100,auVar98,local_400);
        auVar200 = ZEXT1664(auVar85);
        auVar83 = vfmadd231ps_fma(auVar101,auVar98,local_420);
        auVar101 = vfmadd231ps_avx512vl(auVar99,auVar98,local_80);
        auVar102 = vmaxps_avx512vl(auVar92,auVar101);
        auVar99 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar89));
        auVar100 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar84));
        auVar90 = vmulps_avx512vl(ZEXT1632(auVar84),auVar99);
        auVar91 = vmulps_avx512vl(ZEXT1632(auVar89),auVar100);
        auVar90 = vsubps_avx512vl(auVar90,auVar91);
        auVar91 = vmulps_avx512vl(auVar100,auVar100);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,auVar99);
        auVar102 = vmulps_avx512vl(auVar102,auVar102);
        auVar102 = vmulps_avx512vl(auVar102,auVar91);
        auVar90 = vmulps_avx512vl(auVar90,auVar90);
        uVar159 = vcmpps_avx512vl(auVar90,auVar102,2);
        bVar77 = (byte)uVar21 & (byte)uVar159;
        if (bVar77 != 0) {
          auVar104 = vmulps_avx512vl(local_280,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_260,auVar104);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_240,auVar105);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_5e0,auVar97);
          auVar95 = vmulps_avx512vl(local_280,auVar95);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_260,auVar95);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_240,auVar94);
          auVar97 = vfmadd213ps_avx512vl(auVar96,local_5e0,auVar93);
          auVar96 = *(undefined1 (*) [32])(lVar22 + 0x21ab4f4 + lVar73 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar22 + 0x21ab978 + lVar73 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar22 + 0x21abdfc + lVar73 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar22 + 0x21ac280 + lVar73 * 4);
          auVar105 = vmulps_avx512vl(_local_4c0,auVar95);
          auVar104 = vmulps_avx512vl(_local_4e0,auVar95);
          auVar95 = vmulps_avx512vl(local_280,auVar95);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar94,local_480);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar94,local_4a0);
          auVar94 = vfmadd231ps_avx512vl(auVar95,local_260,auVar94);
          auVar95 = vfmadd231ps_avx512vl(auVar105,auVar93,local_440);
          auVar105 = vfmadd231ps_avx512vl(auVar104,auVar93,local_460);
          auVar93 = vfmadd231ps_avx512vl(auVar94,local_240,auVar93);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,local_400);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,local_420);
          auVar82 = vfmadd231ps_fma(auVar93,auVar96,local_5e0);
          auVar96 = *(undefined1 (*) [32])(lVar22 + 0x21ad914 + lVar73 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar22 + 0x21ae21c + lVar73 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar22 + 0x21ae6a0 + lVar73 * 4);
          auVar104 = vmulps_avx512vl(_local_4c0,auVar94);
          auVar102 = vmulps_avx512vl(_local_4e0,auVar94);
          auVar94 = vmulps_avx512vl(local_280,auVar94);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar93,local_480);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_4a0);
          auVar94 = vfmadd231ps_avx512vl(auVar94,local_260,auVar93);
          auVar93 = *(undefined1 (*) [32])(lVar22 + 0x21add98 + lVar73 * 4);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar93,local_440);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_460);
          auVar93 = vfmadd231ps_avx512vl(auVar94,local_240,auVar93);
          auVar94 = vfmadd231ps_avx512vl(auVar104,auVar96,local_400);
          auVar104 = vfmadd231ps_avx512vl(auVar102,auVar96,local_420);
          auVar93 = vfmadd231ps_avx512vl(auVar93,local_5e0,auVar96);
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar95,auVar102);
          vandps_avx512vl(auVar105,auVar102);
          auVar96 = vmaxps_avx(auVar102,auVar102);
          vandps_avx512vl(ZEXT1632(auVar82),auVar102);
          auVar96 = vmaxps_avx(auVar96,auVar102);
          uVar69 = vcmpps_avx512vl(auVar96,_local_560,1);
          bVar13 = (bool)((byte)uVar69 & 1);
          auVar118._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar95._0_4_);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar95._4_4_);
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar95._8_4_);
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar95._12_4_);
          bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar95._16_4_);
          bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar95._20_4_);
          bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar95._24_4_);
          bVar13 = SUB81(uVar69 >> 7,0);
          auVar118._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar95._28_4_;
          bVar13 = (bool)((byte)uVar69 & 1);
          auVar119._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar105._0_4_);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar105._4_4_);
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar105._8_4_);
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar119._12_4_ =
               (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar105._12_4_);
          bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar119._16_4_ =
               (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar105._16_4_);
          bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar119._20_4_ =
               (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar105._20_4_);
          bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar119._24_4_ =
               (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar105._24_4_);
          bVar13 = SUB81(uVar69 >> 7,0);
          auVar119._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar105._28_4_;
          vandps_avx512vl(auVar94,auVar102);
          vandps_avx512vl(auVar104,auVar102);
          auVar96 = vmaxps_avx(auVar119,auVar119);
          vandps_avx512vl(auVar93,auVar102);
          auVar96 = vmaxps_avx(auVar96,auVar119);
          uVar69 = vcmpps_avx512vl(auVar96,_local_560,1);
          bVar13 = (bool)((byte)uVar69 & 1);
          auVar120._0_4_ = (uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar94._0_4_;
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar94._4_4_;
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar94._8_4_;
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar94._12_4_;
          bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar120._16_4_ = (uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar94._16_4_;
          bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar120._20_4_ = (uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar94._20_4_;
          bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar120._24_4_ = (uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar94._24_4_;
          bVar13 = SUB81(uVar69 >> 7,0);
          auVar120._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar94._28_4_;
          bVar13 = (bool)((byte)uVar69 & 1);
          auVar121._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar104._0_4_);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar104._4_4_);
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar104._8_4_);
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar121._12_4_ =
               (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar104._12_4_);
          bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar121._16_4_ =
               (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar104._16_4_);
          bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar121._20_4_ =
               (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar104._20_4_);
          bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar121._24_4_ =
               (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar104._24_4_);
          bVar13 = SUB81(uVar69 >> 7,0);
          auVar121._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar104._28_4_;
          auVar204._8_4_ = 0x80000000;
          auVar204._0_8_ = 0x8000000080000000;
          auVar204._12_4_ = 0x80000000;
          auVar204._16_4_ = 0x80000000;
          auVar204._20_4_ = 0x80000000;
          auVar204._24_4_ = 0x80000000;
          auVar204._28_4_ = 0x80000000;
          auVar96 = vxorps_avx512vl(auVar120,auVar204);
          auVar88 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
          auVar93 = vfmadd213ps_avx512vl(auVar118,auVar118,ZEXT1632(auVar88));
          auVar82 = vfmadd231ps_fma(auVar93,auVar119,auVar119);
          auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
          auVar213._8_4_ = 0xbf000000;
          auVar213._0_8_ = 0xbf000000bf000000;
          auVar213._12_4_ = 0xbf000000;
          auVar213._16_4_ = 0xbf000000;
          auVar213._20_4_ = 0xbf000000;
          auVar213._24_4_ = 0xbf000000;
          auVar213._28_4_ = 0xbf000000;
          fVar163 = auVar93._0_4_;
          fVar162 = auVar93._4_4_;
          fVar157 = auVar93._8_4_;
          fVar158 = auVar93._12_4_;
          fVar172 = auVar93._16_4_;
          fVar173 = auVar93._20_4_;
          fVar181 = auVar93._24_4_;
          auVar46._4_4_ = fVar162 * fVar162 * fVar162 * auVar82._4_4_ * -0.5;
          auVar46._0_4_ = fVar163 * fVar163 * fVar163 * auVar82._0_4_ * -0.5;
          auVar46._8_4_ = fVar157 * fVar157 * fVar157 * auVar82._8_4_ * -0.5;
          auVar46._12_4_ = fVar158 * fVar158 * fVar158 * auVar82._12_4_ * -0.5;
          auVar46._16_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar46._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar46._24_4_ = fVar181 * fVar181 * fVar181 * -0.0;
          auVar46._28_4_ = auVar119._28_4_;
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar93 = vfmadd231ps_avx512vl(auVar46,auVar94,auVar93);
          auVar47._4_4_ = auVar119._4_4_ * auVar93._4_4_;
          auVar47._0_4_ = auVar119._0_4_ * auVar93._0_4_;
          auVar47._8_4_ = auVar119._8_4_ * auVar93._8_4_;
          auVar47._12_4_ = auVar119._12_4_ * auVar93._12_4_;
          auVar47._16_4_ = auVar119._16_4_ * auVar93._16_4_;
          auVar47._20_4_ = auVar119._20_4_ * auVar93._20_4_;
          auVar47._24_4_ = auVar119._24_4_ * auVar93._24_4_;
          auVar47._28_4_ = 0;
          auVar48._4_4_ = auVar93._4_4_ * -auVar118._4_4_;
          auVar48._0_4_ = auVar93._0_4_ * -auVar118._0_4_;
          auVar48._8_4_ = auVar93._8_4_ * -auVar118._8_4_;
          auVar48._12_4_ = auVar93._12_4_ * -auVar118._12_4_;
          auVar48._16_4_ = auVar93._16_4_ * -auVar118._16_4_;
          auVar48._20_4_ = auVar93._20_4_ * -auVar118._20_4_;
          auVar48._24_4_ = auVar93._24_4_ * -auVar118._24_4_;
          auVar48._28_4_ = auVar119._28_4_;
          auVar95 = vmulps_avx512vl(auVar93,ZEXT1632(auVar88));
          auVar104 = ZEXT1632(auVar88);
          auVar93 = vfmadd213ps_avx512vl(auVar120,auVar120,auVar104);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar121,auVar121);
          auVar105 = vrsqrt14ps_avx512vl(auVar93);
          auVar93 = vmulps_avx512vl(auVar93,auVar213);
          fVar163 = auVar105._0_4_;
          fVar162 = auVar105._4_4_;
          fVar157 = auVar105._8_4_;
          fVar158 = auVar105._12_4_;
          fVar172 = auVar105._16_4_;
          fVar173 = auVar105._20_4_;
          fVar181 = auVar105._24_4_;
          auVar49._4_4_ = fVar162 * fVar162 * fVar162 * auVar93._4_4_;
          auVar49._0_4_ = fVar163 * fVar163 * fVar163 * auVar93._0_4_;
          auVar49._8_4_ = fVar157 * fVar157 * fVar157 * auVar93._8_4_;
          auVar49._12_4_ = fVar158 * fVar158 * fVar158 * auVar93._12_4_;
          auVar49._16_4_ = fVar172 * fVar172 * fVar172 * auVar93._16_4_;
          auVar49._20_4_ = fVar173 * fVar173 * fVar173 * auVar93._20_4_;
          auVar49._24_4_ = fVar181 * fVar181 * fVar181 * auVar93._24_4_;
          auVar49._28_4_ = auVar93._28_4_;
          auVar93 = vfmadd231ps_avx512vl(auVar49,auVar94,auVar105);
          auVar50._4_4_ = auVar121._4_4_ * auVar93._4_4_;
          auVar50._0_4_ = auVar121._0_4_ * auVar93._0_4_;
          auVar50._8_4_ = auVar121._8_4_ * auVar93._8_4_;
          auVar50._12_4_ = auVar121._12_4_ * auVar93._12_4_;
          auVar50._16_4_ = auVar121._16_4_ * auVar93._16_4_;
          auVar50._20_4_ = auVar121._20_4_ * auVar93._20_4_;
          auVar50._24_4_ = auVar121._24_4_ * auVar93._24_4_;
          auVar50._28_4_ = auVar105._28_4_;
          auVar51._4_4_ = auVar93._4_4_ * auVar96._4_4_;
          auVar51._0_4_ = auVar93._0_4_ * auVar96._0_4_;
          auVar51._8_4_ = auVar93._8_4_ * auVar96._8_4_;
          auVar51._12_4_ = auVar93._12_4_ * auVar96._12_4_;
          auVar51._16_4_ = auVar93._16_4_ * auVar96._16_4_;
          auVar51._20_4_ = auVar93._20_4_ * auVar96._20_4_;
          auVar51._24_4_ = auVar93._24_4_ * auVar96._24_4_;
          auVar51._28_4_ = auVar96._28_4_;
          auVar96 = vmulps_avx512vl(auVar93,auVar104);
          auVar82 = vfmadd213ps_fma(auVar47,auVar92,ZEXT1632(auVar89));
          auVar7 = vfmadd213ps_fma(auVar48,auVar92,ZEXT1632(auVar84));
          auVar94 = vfmadd213ps_avx512vl(auVar95,auVar92,auVar97);
          auVar105 = vfmadd213ps_avx512vl(auVar50,auVar101,ZEXT1632(auVar85));
          auVar165 = vfnmadd213ps_fma(auVar47,auVar92,ZEXT1632(auVar89));
          auVar89 = vfmadd213ps_fma(auVar51,auVar101,ZEXT1632(auVar83));
          auVar174 = vfnmadd213ps_fma(auVar48,auVar92,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar96,auVar101,auVar98);
          auVar202 = vfnmadd231ps_fma(auVar97,auVar92,auVar95);
          auVar175 = vfnmadd213ps_fma(auVar50,auVar101,ZEXT1632(auVar85));
          auVar86 = vfnmadd213ps_fma(auVar51,auVar101,ZEXT1632(auVar83));
          auVar87 = vfnmadd231ps_fma(auVar98,auVar101,auVar96);
          auVar98 = vsubps_avx512vl(auVar105,ZEXT1632(auVar165));
          auVar96 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar174));
          auVar93 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar202));
          auVar52._4_4_ = auVar96._4_4_ * auVar202._4_4_;
          auVar52._0_4_ = auVar96._0_4_ * auVar202._0_4_;
          auVar52._8_4_ = auVar96._8_4_ * auVar202._8_4_;
          auVar52._12_4_ = auVar96._12_4_ * auVar202._12_4_;
          auVar52._16_4_ = auVar96._16_4_ * 0.0;
          auVar52._20_4_ = auVar96._20_4_ * 0.0;
          auVar52._24_4_ = auVar96._24_4_ * 0.0;
          auVar52._28_4_ = auVar95._28_4_;
          auVar85 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar174),auVar93);
          auVar53._4_4_ = auVar93._4_4_ * auVar165._4_4_;
          auVar53._0_4_ = auVar93._0_4_ * auVar165._0_4_;
          auVar53._8_4_ = auVar93._8_4_ * auVar165._8_4_;
          auVar53._12_4_ = auVar93._12_4_ * auVar165._12_4_;
          auVar53._16_4_ = auVar93._16_4_ * 0.0;
          auVar53._20_4_ = auVar93._20_4_ * 0.0;
          auVar53._24_4_ = auVar93._24_4_ * 0.0;
          auVar53._28_4_ = auVar93._28_4_;
          auVar83 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar202),auVar98);
          auVar54._4_4_ = auVar174._4_4_ * auVar98._4_4_;
          auVar54._0_4_ = auVar174._0_4_ * auVar98._0_4_;
          auVar54._8_4_ = auVar174._8_4_ * auVar98._8_4_;
          auVar54._12_4_ = auVar174._12_4_ * auVar98._12_4_;
          auVar54._16_4_ = auVar98._16_4_ * 0.0;
          auVar54._20_4_ = auVar98._20_4_ * 0.0;
          auVar54._24_4_ = auVar98._24_4_ * 0.0;
          auVar54._28_4_ = auVar98._28_4_;
          auVar164 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar165),auVar96);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar164),auVar104,ZEXT1632(auVar83));
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar104,ZEXT1632(auVar85));
          auVar90 = ZEXT1632(auVar88);
          uVar69 = vcmpps_avx512vl(auVar96,auVar90,2);
          bVar68 = (byte)uVar69;
          fVar131 = (float)((uint)(bVar68 & 1) * auVar82._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar175._0_4_);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar133 = (float)((uint)bVar13 * auVar82._4_4_ | (uint)!bVar13 * auVar175._4_4_);
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar135 = (float)((uint)bVar13 * auVar82._8_4_ | (uint)!bVar13 * auVar175._8_4_);
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar137 = (float)((uint)bVar13 * auVar82._12_4_ | (uint)!bVar13 * auVar175._12_4_);
          auVar104 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar131))));
          fVar132 = (float)((uint)(bVar68 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar86._0_4_);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          fVar134 = (float)((uint)bVar13 * auVar7._4_4_ | (uint)!bVar13 * auVar86._4_4_);
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          fVar136 = (float)((uint)bVar13 * auVar7._8_4_ | (uint)!bVar13 * auVar86._8_4_);
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          fVar138 = (float)((uint)bVar13 * auVar7._12_4_ | (uint)!bVar13 * auVar86._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar132))));
          auVar122._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar87._0_4_);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar87._4_4_);
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar87._8_4_);
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar87._12_4_);
          fVar162 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar94._16_4_);
          auVar122._16_4_ = fVar162;
          fVar157 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar94._20_4_);
          auVar122._20_4_ = fVar157;
          fVar163 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar94._24_4_);
          auVar122._24_4_ = fVar163;
          iVar1 = (uint)(byte)(uVar69 >> 7) * auVar94._28_4_;
          auVar122._28_4_ = iVar1;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar165),auVar105);
          auVar123._0_4_ =
               (uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar85._0_4_;
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar85._4_4_;
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar85._8_4_;
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar85._12_4_;
          auVar123._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_;
          auVar123._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_;
          auVar123._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_;
          auVar123._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar174),ZEXT1632(auVar89));
          auVar124._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar96._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar82._0_4_);
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar82._4_4_);
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar82._8_4_);
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar82._12_4_);
          fVar173 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
          auVar124._16_4_ = fVar173;
          fVar172 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
          auVar124._20_4_ = fVar172;
          fVar158 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
          auVar124._24_4_ = fVar158;
          auVar124._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar202),ZEXT1632(auVar84));
          auVar125._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_
                      );
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar7._4_4_);
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar7._8_4_);
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar7._12_4_);
          fVar181 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar96._16_4_);
          auVar125._16_4_ = fVar181;
          fVar79 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar96._20_4_);
          auVar125._20_4_ = fVar79;
          fVar80 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar96._24_4_);
          auVar125._24_4_ = fVar80;
          iVar2 = (uint)(byte)(uVar69 >> 7) * auVar96._28_4_;
          auVar125._28_4_ = iVar2;
          auVar126._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar165._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar105._0_4_
          ;
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar13 * (int)auVar165._4_4_ | (uint)!bVar13 * auVar105._4_4_;
          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar13 * (int)auVar165._8_4_ | (uint)!bVar13 * auVar105._8_4_;
          bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar13 * (int)auVar165._12_4_ | (uint)!bVar13 * auVar105._12_4_;
          auVar126._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar105._16_4_;
          auVar126._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar105._20_4_;
          auVar126._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar105._24_4_;
          auVar126._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar105._28_4_;
          bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar105 = vsubps_avx512vl(auVar126,auVar104);
          auVar93 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar174._12_4_ |
                                                  (uint)!bVar17 * auVar89._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)auVar174._8_4_ |
                                                           (uint)!bVar15 * auVar89._8_4_,
                                                           CONCAT44((uint)bVar13 *
                                                                    (int)auVar174._4_4_ |
                                                                    (uint)!bVar13 * auVar89._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar174._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar89._0_4_)))),auVar99);
          auVar197 = ZEXT3264(auVar93);
          auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar202._12_4_ |
                                                  (uint)!bVar18 * auVar84._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar202._8_4_ |
                                                           (uint)!bVar16 * auVar84._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar202._4_4_ |
                                                                    (uint)!bVar14 * auVar84._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar202._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar84._0_4_)))),auVar122);
          auVar95 = vsubps_avx(auVar104,auVar123);
          auVar200 = ZEXT3264(auVar95);
          auVar98 = vsubps_avx(auVar99,auVar124);
          auVar97 = vsubps_avx(auVar122,auVar125);
          auVar55._4_4_ = auVar94._4_4_ * fVar133;
          auVar55._0_4_ = auVar94._0_4_ * fVar131;
          auVar55._8_4_ = auVar94._8_4_ * fVar135;
          auVar55._12_4_ = auVar94._12_4_ * fVar137;
          auVar55._16_4_ = auVar94._16_4_ * 0.0;
          auVar55._20_4_ = auVar94._20_4_ * 0.0;
          auVar55._24_4_ = auVar94._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar55,auVar122,auVar105);
          auVar180._0_4_ = fVar132 * auVar105._0_4_;
          auVar180._4_4_ = fVar134 * auVar105._4_4_;
          auVar180._8_4_ = fVar136 * auVar105._8_4_;
          auVar180._12_4_ = fVar138 * auVar105._12_4_;
          auVar180._16_4_ = auVar105._16_4_ * 0.0;
          auVar180._20_4_ = auVar105._20_4_ * 0.0;
          auVar180._24_4_ = auVar105._24_4_ * 0.0;
          auVar180._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar180,auVar104,auVar93);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar90,ZEXT1632(auVar89));
          auVar184._0_4_ = auVar93._0_4_ * auVar122._0_4_;
          auVar184._4_4_ = auVar93._4_4_ * auVar122._4_4_;
          auVar184._8_4_ = auVar93._8_4_ * auVar122._8_4_;
          auVar184._12_4_ = auVar93._12_4_ * auVar122._12_4_;
          auVar184._16_4_ = auVar93._16_4_ * fVar162;
          auVar184._20_4_ = auVar93._20_4_ * fVar157;
          auVar184._24_4_ = auVar93._24_4_ * fVar163;
          auVar184._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar184,auVar99,auVar94);
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar89));
          auVar96 = vmulps_avx512vl(auVar97,auVar123);
          auVar96 = vfmsub231ps_avx512vl(auVar96,auVar95,auVar125);
          auVar56._4_4_ = auVar98._4_4_ * auVar125._4_4_;
          auVar56._0_4_ = auVar98._0_4_ * auVar125._0_4_;
          auVar56._8_4_ = auVar98._8_4_ * auVar125._8_4_;
          auVar56._12_4_ = auVar98._12_4_ * auVar125._12_4_;
          auVar56._16_4_ = auVar98._16_4_ * fVar181;
          auVar56._20_4_ = auVar98._20_4_ * fVar79;
          auVar56._24_4_ = auVar98._24_4_ * fVar80;
          auVar56._28_4_ = iVar2;
          auVar89 = vfmsub231ps_fma(auVar56,auVar124,auVar97);
          auVar185._0_4_ = auVar124._0_4_ * auVar95._0_4_;
          auVar185._4_4_ = auVar124._4_4_ * auVar95._4_4_;
          auVar185._8_4_ = auVar124._8_4_ * auVar95._8_4_;
          auVar185._12_4_ = auVar124._12_4_ * auVar95._12_4_;
          auVar185._16_4_ = fVar173 * auVar95._16_4_;
          auVar185._20_4_ = fVar172 * auVar95._20_4_;
          auVar185._24_4_ = fVar158 * auVar95._24_4_;
          auVar185._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar185,auVar98,auVar123);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar90,auVar96);
          auVar102 = vfmadd231ps_avx512vl(auVar96,auVar90,ZEXT1632(auVar89));
          auVar188 = ZEXT3264(auVar102);
          auVar96 = vmaxps_avx(auVar100,auVar102);
          uVar159 = vcmpps_avx512vl(auVar96,auVar90,2);
          bVar77 = bVar77 & (byte)uVar159;
          if (bVar77 != 0) {
            uVar140 = *(undefined4 *)(ray + sVar76 * 4 + 0x100);
            auVar214._4_4_ = uVar140;
            auVar214._0_4_ = uVar140;
            auVar214._8_4_ = uVar140;
            auVar214._12_4_ = uVar140;
            auVar214._16_4_ = uVar140;
            auVar214._20_4_ = uVar140;
            auVar214._24_4_ = uVar140;
            auVar214._28_4_ = uVar140;
            auVar201 = ZEXT3264(auVar214);
            auVar57._4_4_ = auVar97._4_4_ * auVar93._4_4_;
            auVar57._0_4_ = auVar97._0_4_ * auVar93._0_4_;
            auVar57._8_4_ = auVar97._8_4_ * auVar93._8_4_;
            auVar57._12_4_ = auVar97._12_4_ * auVar93._12_4_;
            auVar57._16_4_ = auVar97._16_4_ * auVar93._16_4_;
            auVar57._20_4_ = auVar97._20_4_ * auVar93._20_4_;
            auVar57._24_4_ = auVar97._24_4_ * auVar93._24_4_;
            auVar57._28_4_ = auVar96._28_4_;
            auVar83 = vfmsub231ps_fma(auVar57,auVar98,auVar94);
            auVar58._4_4_ = auVar94._4_4_ * auVar95._4_4_;
            auVar58._0_4_ = auVar94._0_4_ * auVar95._0_4_;
            auVar58._8_4_ = auVar94._8_4_ * auVar95._8_4_;
            auVar58._12_4_ = auVar94._12_4_ * auVar95._12_4_;
            auVar58._16_4_ = auVar94._16_4_ * auVar95._16_4_;
            auVar58._20_4_ = auVar94._20_4_ * auVar95._20_4_;
            auVar58._24_4_ = auVar94._24_4_ * auVar95._24_4_;
            auVar58._28_4_ = auVar94._28_4_;
            auVar85 = vfmsub231ps_fma(auVar58,auVar105,auVar97);
            auVar59._4_4_ = auVar98._4_4_ * auVar105._4_4_;
            auVar59._0_4_ = auVar98._0_4_ * auVar105._0_4_;
            auVar59._8_4_ = auVar98._8_4_ * auVar105._8_4_;
            auVar59._12_4_ = auVar98._12_4_ * auVar105._12_4_;
            auVar59._16_4_ = auVar98._16_4_ * auVar105._16_4_;
            auVar59._20_4_ = auVar98._20_4_ * auVar105._20_4_;
            auVar59._24_4_ = auVar98._24_4_ * auVar105._24_4_;
            auVar59._28_4_ = auVar98._28_4_;
            auVar82 = vfmsub231ps_fma(auVar59,auVar95,auVar93);
            auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar82));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar83),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar96 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
            auVar200 = ZEXT3264(auVar96);
            auVar94 = auVar217._0_32_;
            auVar93 = vfnmadd213ps_avx512vl(auVar96,ZEXT1632(auVar84),auVar94);
            auVar89 = vfmadd132ps_fma(auVar93,auVar96,auVar96);
            auVar197 = ZEXT1664(auVar89);
            auVar60._4_4_ = auVar82._4_4_ * auVar122._4_4_;
            auVar60._0_4_ = auVar82._0_4_ * auVar122._0_4_;
            auVar60._8_4_ = auVar82._8_4_ * auVar122._8_4_;
            auVar60._12_4_ = auVar82._12_4_ * auVar122._12_4_;
            auVar60._16_4_ = fVar162 * 0.0;
            auVar60._20_4_ = fVar157 * 0.0;
            auVar60._24_4_ = fVar163 * 0.0;
            auVar60._28_4_ = iVar1;
            auVar85 = vfmadd231ps_fma(auVar60,auVar99,ZEXT1632(auVar85));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,ZEXT1632(auVar83));
            fVar163 = auVar89._0_4_;
            fVar162 = auVar89._4_4_;
            fVar157 = auVar89._8_4_;
            fVar158 = auVar89._12_4_;
            local_3a0 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar158,
                                           CONCAT48(auVar85._8_4_ * fVar157,
                                                    CONCAT44(auVar85._4_4_ * fVar162,
                                                             auVar85._0_4_ * fVar163))));
            auVar216 = ZEXT3264(local_3a0);
            uVar159 = vcmpps_avx512vl(local_3a0,auVar214,2);
            uVar21 = vcmpps_avx512vl(local_3a0,local_500,0xd);
            bVar77 = (byte)uVar159 & (byte)uVar21 & bVar77;
            if (bVar77 != 0) {
              uVar78 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar78 = bVar77 & uVar78;
              if ((char)uVar78 != '\0') {
                fVar172 = auVar100._0_4_ * fVar163;
                fVar173 = auVar100._4_4_ * fVar162;
                auVar61._4_4_ = fVar173;
                auVar61._0_4_ = fVar172;
                fVar181 = auVar100._8_4_ * fVar157;
                auVar61._8_4_ = fVar181;
                fVar79 = auVar100._12_4_ * fVar158;
                auVar61._12_4_ = fVar79;
                fVar80 = auVar100._16_4_ * 0.0;
                auVar61._16_4_ = fVar80;
                fVar131 = auVar100._20_4_ * 0.0;
                auVar61._20_4_ = fVar131;
                fVar132 = auVar100._24_4_ * 0.0;
                auVar61._24_4_ = fVar132;
                auVar61._28_4_ = auVar100._28_4_;
                auVar96 = vsubps_avx512vl(auVar94,auVar61);
                local_3e0._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar172 |
                            (uint)!(bool)(bVar68 & 1) * auVar96._0_4_);
                bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
                local_3e0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar173 | (uint)!bVar13 * auVar96._4_4_);
                bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                local_3e0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar181 | (uint)!bVar13 * auVar96._8_4_);
                bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
                local_3e0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar79 | (uint)!bVar13 * auVar96._12_4_);
                bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
                local_3e0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar80 | (uint)!bVar13 * auVar96._16_4_);
                bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
                local_3e0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar131 | (uint)!bVar13 * auVar96._20_4_);
                bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
                local_3e0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar132 | (uint)!bVar13 * auVar96._24_4_);
                bVar13 = SUB81(uVar69 >> 7,0);
                local_3e0._28_4_ =
                     (float)((uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar96._28_4_);
                auVar96 = vsubps_avx(auVar101,auVar92);
                auVar89 = vfmadd213ps_fma(auVar96,local_3e0,auVar92);
                uVar140 = *(undefined4 *)((long)pre->ray_space + sVar76 * 4 + -0x20);
                auVar26._4_4_ = uVar140;
                auVar26._0_4_ = uVar140;
                auVar26._8_4_ = uVar140;
                auVar26._12_4_ = uVar140;
                auVar26._16_4_ = uVar140;
                auVar26._20_4_ = uVar140;
                auVar26._24_4_ = uVar140;
                auVar26._28_4_ = uVar140;
                auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                             CONCAT48(auVar89._8_4_ + auVar89._8_4_,
                                                                      CONCAT44(auVar89._4_4_ +
                                                                               auVar89._4_4_,
                                                                               auVar89._0_4_ +
                                                                               auVar89._0_4_)))),
                                          auVar26);
                uVar72 = vcmpps_avx512vl(local_3a0,auVar96,6);
                uVar78 = uVar78 & uVar72;
                bVar77 = (byte)uVar78;
                if (bVar77 != 0) {
                  auVar161._0_4_ = auVar102._0_4_ * fVar163;
                  auVar161._4_4_ = auVar102._4_4_ * fVar162;
                  auVar161._8_4_ = auVar102._8_4_ * fVar157;
                  auVar161._12_4_ = auVar102._12_4_ * fVar158;
                  auVar161._16_4_ = auVar102._16_4_ * 0.0;
                  auVar161._20_4_ = auVar102._20_4_ * 0.0;
                  auVar161._24_4_ = auVar102._24_4_ * 0.0;
                  auVar161._28_4_ = 0;
                  auVar96 = vsubps_avx512vl(auVar94,auVar161);
                  auVar127._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar161._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar96._0_4_;
                  bVar13 = (bool)((byte)(uVar69 >> 1) & 1);
                  auVar127._4_4_ =
                       (uint)bVar13 * (int)auVar161._4_4_ | (uint)!bVar13 * auVar96._4_4_;
                  bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                  auVar127._8_4_ =
                       (uint)bVar13 * (int)auVar161._8_4_ | (uint)!bVar13 * auVar96._8_4_;
                  bVar13 = (bool)((byte)(uVar69 >> 3) & 1);
                  auVar127._12_4_ =
                       (uint)bVar13 * (int)auVar161._12_4_ | (uint)!bVar13 * auVar96._12_4_;
                  bVar13 = (bool)((byte)(uVar69 >> 4) & 1);
                  auVar127._16_4_ =
                       (uint)bVar13 * (int)auVar161._16_4_ | (uint)!bVar13 * auVar96._16_4_;
                  bVar13 = (bool)((byte)(uVar69 >> 5) & 1);
                  auVar127._20_4_ =
                       (uint)bVar13 * (int)auVar161._20_4_ | (uint)!bVar13 * auVar96._20_4_;
                  bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
                  auVar127._24_4_ =
                       (uint)bVar13 * (int)auVar161._24_4_ | (uint)!bVar13 * auVar96._24_4_;
                  auVar127._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar96._28_4_;
                  auVar27._8_4_ = 0x40000000;
                  auVar27._0_8_ = 0x4000000040000000;
                  auVar27._12_4_ = 0x40000000;
                  auVar27._16_4_ = 0x40000000;
                  auVar27._20_4_ = 0x40000000;
                  auVar27._24_4_ = 0x40000000;
                  auVar27._28_4_ = 0x40000000;
                  local_3c0 = vfmsub132ps_avx512vl(auVar127,auVar94,auVar27);
                  local_380 = (undefined4)lVar73;
                  auVar200 = ZEXT1664(auVar81);
                  local_360 = local_660;
                  uStack_358 = uStack_658;
                  local_350 = local_670;
                  uStack_348 = uStack_668;
                  local_340 = local_680;
                  uStack_338 = uStack_678;
                  pGVar11 = (context->scene->geometries).items[uVar74].ptr;
                  if ((pGVar11->mask & *(uint *)(ray + sVar76 * 4 + 0x120)) != 0) {
                    auVar89 = vcvtsi2ss_avx512f(auVar88,local_380);
                    fVar163 = auVar89._0_4_;
                    local_320[0] = (fVar163 + local_3e0._0_4_ + 0.0) * local_100;
                    local_320[1] = (fVar163 + local_3e0._4_4_ + 1.0) * fStack_fc;
                    local_320[2] = (fVar163 + local_3e0._8_4_ + 2.0) * fStack_f8;
                    local_320[3] = (fVar163 + local_3e0._12_4_ + 3.0) * fStack_f4;
                    fStack_310 = (fVar163 + local_3e0._16_4_ + 4.0) * fStack_f0;
                    fStack_30c = (fVar163 + local_3e0._20_4_ + 5.0) * fStack_ec;
                    fStack_308 = (fVar163 + local_3e0._24_4_ + 6.0) * fStack_e8;
                    fStack_304 = fVar163 + local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    auVar149._8_4_ = 0x7f800000;
                    auVar149._0_8_ = 0x7f8000007f800000;
                    auVar149._12_4_ = 0x7f800000;
                    auVar149._16_4_ = 0x7f800000;
                    auVar149._20_4_ = 0x7f800000;
                    auVar149._24_4_ = 0x7f800000;
                    auVar149._28_4_ = 0x7f800000;
                    auVar96 = vblendmps_avx512vl(auVar149,local_3a0);
                    auVar128._0_4_ =
                         (uint)(bVar77 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000
                    ;
                    bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                    auVar128._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                    auVar128._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
                    auVar128._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
                    auVar128._16_4_ = (uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                    auVar128._20_4_ = (uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
                    auVar128._24_4_ = (uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar78 >> 7,0);
                    auVar128._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar96 = vshufps_avx(auVar128,auVar128,0xb1);
                    auVar96 = vminps_avx(auVar128,auVar96);
                    auVar93 = vshufpd_avx(auVar96,auVar96,5);
                    auVar96 = vminps_avx(auVar96,auVar93);
                    auVar93 = vpermpd_avx2(auVar96,0x4e);
                    auVar96 = vminps_avx(auVar96,auVar93);
                    uVar159 = vcmpps_avx512vl(auVar128,auVar96,0);
                    uVar70 = (uint)uVar78;
                    if (((byte)uVar159 & bVar77) != 0) {
                      uVar70 = (uint)((byte)uVar159 & bVar77);
                    }
                    uVar71 = 0;
                    for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar69 = (ulong)uVar71;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_2c0 = local_3a0;
                      local_37c = iVar9;
                      local_370 = auVar81;
                      do {
                        local_1c0 = local_320[uVar69];
                        local_1a0 = *(undefined4 *)(local_300 + uVar69 * 4);
                        *(undefined4 *)(ray + sVar76 * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + uVar69 * 4);
                        local_650.context = context->user;
                        fVar162 = 1.0 - local_1c0;
                        fVar163 = fVar162 * fVar162 * -3.0;
                        auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),
                                                  ZEXT416((uint)(local_1c0 * fVar162)),
                                                  ZEXT416(0xc0000000));
                        auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar162)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar162 = auVar89._0_4_ * 3.0;
                        fVar157 = auVar84._0_4_ * 3.0;
                        fVar158 = local_1c0 * local_1c0 * 3.0;
                        auVar191._0_4_ = fVar158 * fVar139;
                        auVar191._4_4_ = fVar158 * fVar154;
                        auVar191._8_4_ = fVar158 * fVar155;
                        auVar191._12_4_ = fVar158 * fVar156;
                        auVar141._4_4_ = fVar157;
                        auVar141._0_4_ = fVar157;
                        auVar141._8_4_ = fVar157;
                        auVar141._12_4_ = fVar157;
                        auVar89 = vfmadd132ps_fma(auVar141,auVar191,auVar6);
                        auVar178._4_4_ = fVar162;
                        auVar178._0_4_ = fVar162;
                        auVar178._8_4_ = fVar162;
                        auVar178._12_4_ = fVar162;
                        auVar89 = vfmadd132ps_fma(auVar178,auVar89,auVar20);
                        auVar142._4_4_ = fVar163;
                        auVar142._0_4_ = fVar163;
                        auVar142._8_4_ = fVar163;
                        auVar142._12_4_ = fVar163;
                        auVar89 = vfmadd213ps_fma(auVar142,auVar81,auVar89);
                        local_220 = auVar89._0_4_;
                        auVar186._8_4_ = 1;
                        auVar186._0_8_ = 0x100000001;
                        auVar186._12_4_ = 1;
                        auVar186._16_4_ = 1;
                        auVar186._20_4_ = 1;
                        auVar186._24_4_ = 1;
                        auVar186._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar186,ZEXT1632(auVar89));
                        auVar188 = ZEXT3264(local_200);
                        auVar192._8_4_ = 2;
                        auVar192._0_8_ = 0x200000002;
                        auVar192._12_4_ = 2;
                        auVar195._16_4_ = 2;
                        auVar195._0_16_ = auVar192;
                        auVar195._20_4_ = 2;
                        auVar195._24_4_ = 2;
                        auVar195._28_4_ = 2;
                        auVar197 = ZEXT3264(auVar195);
                        local_1e0 = vpermps_avx2(auVar195,ZEXT1632(auVar89));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_580._0_8_;
                        uStack_178 = local_580._8_8_;
                        uStack_170 = local_580._16_8_;
                        uStack_168 = local_580._24_8_;
                        local_160 = local_520;
                        auVar96 = vpcmpeqd_avx2(local_520,local_520);
                        local_608[1] = auVar96;
                        *local_608 = auVar96;
                        local_140 = (local_650.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_650.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_600 = local_2a0;
                        local_650.valid = (int *)local_600;
                        local_650.geometryUserPtr = pGVar11->userPtr;
                        local_650.hit = (RTCHitN *)&local_220;
                        local_650.N = 8;
                        local_5a0 = auVar201._0_32_;
                        local_620._0_4_ = (int)uVar78;
                        local_650.ray = (RTCRayN *)ray;
                        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar188 = ZEXT1664(local_200._0_16_);
                          auVar197 = ZEXT1664(auVar192);
                          (*pGVar11->intersectionFilterN)(&local_650);
                          uVar78 = (ulong)(uint)local_620._0_4_;
                          auVar216 = ZEXT3264(local_2c0);
                          auVar201 = ZEXT3264(local_5a0);
                        }
                        bVar77 = (byte)uVar78;
                        if (local_600 == (undefined1  [32])0x0) {
LAB_01c884d2:
                          *(int *)(ray + sVar76 * 4 + 0x100) = auVar201._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar188 = ZEXT1664(auVar188._0_16_);
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            (*p_Var12)(&local_650);
                            bVar77 = local_620[0];
                            auVar216 = ZEXT3264(local_2c0);
                            auVar201 = ZEXT3264(local_5a0);
                          }
                          if (local_600 == (undefined1  [32])0x0) goto LAB_01c884d2;
                          uVar78 = vptestmd_avx512vl(local_600,local_600);
                          iVar1 = *(int *)(local_650.hit + 4);
                          iVar2 = *(int *)(local_650.hit + 8);
                          iVar63 = *(int *)(local_650.hit + 0xc);
                          iVar64 = *(int *)(local_650.hit + 0x10);
                          iVar65 = *(int *)(local_650.hit + 0x14);
                          iVar66 = *(int *)(local_650.hit + 0x18);
                          iVar67 = *(int *)(local_650.hit + 0x1c);
                          bVar68 = (byte)uVar78;
                          bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar19 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_650.ray + 0x180) =
                               (uint)(bVar68 & 1) * *(int *)local_650.hit |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_650.ray + 0x180);
                          *(uint *)(local_650.ray + 0x184) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x184);
                          *(uint *)(local_650.ray + 0x188) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x188);
                          *(uint *)(local_650.ray + 0x18c) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x18c);
                          *(uint *)(local_650.ray + 400) =
                               (uint)bVar16 * iVar64 | (uint)!bVar16 * *(int *)(local_650.ray + 400)
                          ;
                          *(uint *)(local_650.ray + 0x194) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x194);
                          *(uint *)(local_650.ray + 0x198) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x198);
                          *(uint *)(local_650.ray + 0x19c) =
                               (uint)bVar19 * iVar67 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x19c);
                          iVar1 = *(int *)(local_650.hit + 0x24);
                          iVar2 = *(int *)(local_650.hit + 0x28);
                          iVar63 = *(int *)(local_650.hit + 0x2c);
                          iVar64 = *(int *)(local_650.hit + 0x30);
                          iVar65 = *(int *)(local_650.hit + 0x34);
                          iVar66 = *(int *)(local_650.hit + 0x38);
                          iVar67 = *(int *)(local_650.hit + 0x3c);
                          bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar19 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_650.ray + 0x1a0) =
                               (uint)(bVar68 & 1) * *(int *)(local_650.hit + 0x20) |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_650.ray + 0x1a0);
                          *(uint *)(local_650.ray + 0x1a4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1a4);
                          *(uint *)(local_650.ray + 0x1a8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1a8);
                          *(uint *)(local_650.ray + 0x1ac) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1ac);
                          *(uint *)(local_650.ray + 0x1b0) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1b0);
                          *(uint *)(local_650.ray + 0x1b4) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x1b4);
                          *(uint *)(local_650.ray + 0x1b8) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x1b8);
                          *(uint *)(local_650.ray + 0x1bc) =
                               (uint)bVar19 * iVar67 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x1bc);
                          iVar1 = *(int *)(local_650.hit + 0x44);
                          iVar2 = *(int *)(local_650.hit + 0x48);
                          iVar63 = *(int *)(local_650.hit + 0x4c);
                          iVar64 = *(int *)(local_650.hit + 0x50);
                          iVar65 = *(int *)(local_650.hit + 0x54);
                          iVar66 = *(int *)(local_650.hit + 0x58);
                          iVar67 = *(int *)(local_650.hit + 0x5c);
                          bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar19 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_650.ray + 0x1c0) =
                               (uint)(bVar68 & 1) * *(int *)(local_650.hit + 0x40) |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_650.ray + 0x1c0);
                          *(uint *)(local_650.ray + 0x1c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1c4);
                          *(uint *)(local_650.ray + 0x1c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1c8);
                          *(uint *)(local_650.ray + 0x1cc) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1cc);
                          *(uint *)(local_650.ray + 0x1d0) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1d0);
                          *(uint *)(local_650.ray + 0x1d4) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x1d4);
                          *(uint *)(local_650.ray + 0x1d8) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x1d8);
                          *(uint *)(local_650.ray + 0x1dc) =
                               (uint)bVar19 * iVar67 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x1dc);
                          iVar1 = *(int *)(local_650.hit + 100);
                          iVar2 = *(int *)(local_650.hit + 0x68);
                          iVar63 = *(int *)(local_650.hit + 0x6c);
                          iVar64 = *(int *)(local_650.hit + 0x70);
                          iVar65 = *(int *)(local_650.hit + 0x74);
                          iVar66 = *(int *)(local_650.hit + 0x78);
                          iVar67 = *(int *)(local_650.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar19 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_650.ray + 0x1e0) =
                               (uint)(bVar68 & 1) * *(int *)(local_650.hit + 0x60) |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_650.ray + 0x1e0);
                          *(uint *)(local_650.ray + 0x1e4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x1e4);
                          *(uint *)(local_650.ray + 0x1e8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x1e8);
                          *(uint *)(local_650.ray + 0x1ec) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x1ec);
                          *(uint *)(local_650.ray + 0x1f0) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x1f0);
                          *(uint *)(local_650.ray + 500) =
                               (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_650.ray + 500)
                          ;
                          *(uint *)(local_650.ray + 0x1f8) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x1f8);
                          *(uint *)(local_650.ray + 0x1fc) =
                               (uint)bVar19 * iVar67 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x1fc);
                          iVar1 = *(int *)(local_650.hit + 0x84);
                          iVar2 = *(int *)(local_650.hit + 0x88);
                          iVar63 = *(int *)(local_650.hit + 0x8c);
                          iVar64 = *(int *)(local_650.hit + 0x90);
                          iVar65 = *(int *)(local_650.hit + 0x94);
                          iVar66 = *(int *)(local_650.hit + 0x98);
                          iVar67 = *(int *)(local_650.hit + 0x9c);
                          bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar19 = SUB81(uVar78 >> 7,0);
                          *(uint *)(local_650.ray + 0x200) =
                               (uint)(bVar68 & 1) * *(int *)(local_650.hit + 0x80) |
                               (uint)!(bool)(bVar68 & 1) * *(int *)(local_650.ray + 0x200);
                          *(uint *)(local_650.ray + 0x204) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_650.ray + 0x204);
                          *(uint *)(local_650.ray + 0x208) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_650.ray + 0x208);
                          *(uint *)(local_650.ray + 0x20c) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_650.ray + 0x20c);
                          *(uint *)(local_650.ray + 0x210) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_650.ray + 0x210);
                          *(uint *)(local_650.ray + 0x214) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_650.ray + 0x214);
                          *(uint *)(local_650.ray + 0x218) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_650.ray + 0x218);
                          *(uint *)(local_650.ray + 0x21c) =
                               (uint)bVar19 * iVar67 |
                               (uint)!bVar19 * *(int *)(local_650.ray + 0x21c);
                          auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xa0))
                          ;
                          *(undefined1 (*) [32])(local_650.ray + 0x220) = auVar96;
                          auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xc0))
                          ;
                          *(undefined1 (*) [32])(local_650.ray + 0x240) = auVar96;
                          auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0xe0))
                          ;
                          *(undefined1 (*) [32])(local_650.ray + 0x260) = auVar96;
                          auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_650.hit + 0x100)
                                                      );
                          *(undefined1 (*) [32])(local_650.ray + 0x280) = auVar96;
                          auVar201 = ZEXT464(*(uint *)(ray + sVar76 * 4 + 0x100));
                        }
                        auVar200 = ZEXT1664(auVar81);
                        bVar77 = ~(byte)(1 << ((uint)uVar69 & 0x1f)) & bVar77;
                        uVar140 = auVar201._0_4_;
                        auVar150._4_4_ = uVar140;
                        auVar150._0_4_ = uVar140;
                        auVar150._8_4_ = uVar140;
                        auVar150._12_4_ = uVar140;
                        auVar150._16_4_ = uVar140;
                        auVar150._20_4_ = uVar140;
                        auVar150._24_4_ = uVar140;
                        auVar150._28_4_ = uVar140;
                        uVar159 = vcmpps_avx512vl(auVar216._0_32_,auVar150,2);
                        if ((bVar77 & (byte)uVar159) == 0) goto LAB_01c88562;
                        bVar77 = bVar77 & (byte)uVar159;
                        uVar78 = (ulong)bVar77;
                        auVar151._8_4_ = 0x7f800000;
                        auVar151._0_8_ = 0x7f8000007f800000;
                        auVar151._12_4_ = 0x7f800000;
                        auVar151._16_4_ = 0x7f800000;
                        auVar151._20_4_ = 0x7f800000;
                        auVar151._24_4_ = 0x7f800000;
                        auVar151._28_4_ = 0x7f800000;
                        auVar96 = vblendmps_avx512vl(auVar151,auVar216._0_32_);
                        auVar129._0_4_ =
                             (uint)(bVar77 & 1) * auVar96._0_4_ |
                             (uint)!(bool)(bVar77 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar77 >> 1 & 1);
                        auVar129._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar77 >> 2 & 1);
                        auVar129._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar77 >> 3 & 1);
                        auVar129._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * 0x7f800000
                        ;
                        bVar13 = (bool)(bVar77 >> 4 & 1);
                        auVar129._16_4_ = (uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * 0x7f800000
                        ;
                        bVar13 = (bool)(bVar77 >> 5 & 1);
                        auVar129._20_4_ = (uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * 0x7f800000
                        ;
                        bVar13 = (bool)(bVar77 >> 6 & 1);
                        auVar129._24_4_ = (uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * 0x7f800000
                        ;
                        auVar129._28_4_ =
                             (uint)(bVar77 >> 7) * auVar96._28_4_ |
                             (uint)!(bool)(bVar77 >> 7) * 0x7f800000;
                        auVar96 = vshufps_avx(auVar129,auVar129,0xb1);
                        auVar96 = vminps_avx(auVar129,auVar96);
                        auVar93 = vshufpd_avx(auVar96,auVar96,5);
                        auVar96 = vminps_avx(auVar96,auVar93);
                        auVar93 = vpermpd_avx2(auVar96,0x4e);
                        auVar96 = vminps_avx(auVar96,auVar93);
                        uVar159 = vcmpps_avx512vl(auVar129,auVar96,0);
                        bVar68 = (byte)uVar159 & bVar77;
                        if (bVar68 != 0) {
                          bVar77 = bVar68;
                        }
                        uVar70 = 0;
                        for (uVar71 = (uint)bVar77; (uVar71 & 1) == 0;
                            uVar71 = uVar71 >> 1 | 0x80000000) {
                          uVar70 = uVar70 + 1;
                        }
                        uVar69 = (ulong)uVar70;
                      } while( true );
                    }
                    fVar163 = local_320[uVar69];
                    uVar140 = *(undefined4 *)(local_300 + uVar69 * 4);
                    fVar157 = 1.0 - fVar163;
                    fVar162 = fVar157 * fVar157 * -3.0;
                    auVar188 = ZEXT464((uint)fVar162);
                    auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * fVar157)),
                                              ZEXT416((uint)(fVar163 * fVar157)),ZEXT416(0xc0000000)
                                             );
                    auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar157)),
                                              ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000)
                                             );
                    fVar157 = auVar89._0_4_ * 3.0;
                    fVar158 = auVar84._0_4_ * 3.0;
                    fVar172 = fVar163 * fVar163 * 3.0;
                    auVar190._0_4_ = fVar172 * fVar139;
                    auVar190._4_4_ = fVar172 * fVar154;
                    auVar190._8_4_ = fVar172 * fVar155;
                    auVar190._12_4_ = fVar172 * fVar156;
                    auVar197 = ZEXT1664(auVar190);
                    auVar168._4_4_ = fVar158;
                    auVar168._0_4_ = fVar158;
                    auVar168._8_4_ = fVar158;
                    auVar168._12_4_ = fVar158;
                    auVar89 = vfmadd132ps_fma(auVar168,auVar190,auVar6);
                    auVar177._4_4_ = fVar157;
                    auVar177._0_4_ = fVar157;
                    auVar177._8_4_ = fVar157;
                    auVar177._12_4_ = fVar157;
                    auVar89 = vfmadd132ps_fma(auVar177,auVar89,auVar20);
                    auVar169._4_4_ = fVar162;
                    auVar169._0_4_ = fVar162;
                    auVar169._8_4_ = fVar162;
                    auVar169._12_4_ = fVar162;
                    auVar89 = vfmadd213ps_fma(auVar169,auVar81,auVar89);
                    *(undefined4 *)(ray + sVar76 * 4 + 0x100) =
                         *(undefined4 *)(local_2e0 + uVar69 * 4);
                    *(int *)(ray + sVar76 * 4 + 0x180) = auVar89._0_4_;
                    uVar10 = vextractps_avx(auVar89,1);
                    *(undefined4 *)(ray + sVar76 * 4 + 0x1a0) = uVar10;
                    uVar10 = vextractps_avx(auVar89,2);
                    *(undefined4 *)(ray + sVar76 * 4 + 0x1c0) = uVar10;
                    *(float *)(ray + sVar76 * 4 + 0x1e0) = fVar163;
                    *(undefined4 *)(ray + sVar76 * 4 + 0x200) = uVar140;
                    *(undefined4 *)(ray + sVar76 * 4 + 0x220) = uVar3;
                    *(uint *)(ray + sVar76 * 4 + 0x240) = uVar74;
                    *(uint *)(ray + sVar76 * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + sVar76 * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01c881a3;
      }
LAB_01c8782e:
      uVar3 = *(undefined4 *)(ray + sVar76 * 4 + 0x100);
      auVar25._4_4_ = uVar3;
      auVar25._0_4_ = uVar3;
      auVar25._8_4_ = uVar3;
      auVar25._12_4_ = uVar3;
      auVar25._16_4_ = uVar3;
      auVar25._20_4_ = uVar3;
      auVar25._24_4_ = uVar3;
      auVar25._28_4_ = uVar3;
      uVar159 = vcmpps_avx512vl(auVar218._0_32_,auVar25,2);
      uVar74 = (uint)uVar75 & (uint)uVar159;
      uVar75 = (ulong)uVar74;
    } while (uVar74 != 0);
  }
  return;
LAB_01c88562:
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar217 = ZEXT3264(auVar96);
  auVar218 = ZEXT3264(local_540);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar219 = ZEXT1664(auVar89);
LAB_01c881a3:
  lVar73 = lVar73 + 8;
  if (iVar9 <= (int)lVar73) goto LAB_01c8782e;
  goto LAB_01c878cf;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }